

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx512::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  int iVar10;
  undefined4 uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  code *pcVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined8 uVar23;
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  long lVar72;
  int iVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  byte bVar83;
  byte bVar84;
  ulong uVar85;
  uint uVar86;
  uint uVar87;
  ulong uVar88;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  long lVar89;
  uint uVar90;
  ulong uVar91;
  byte bVar92;
  ulong uVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar147;
  float fVar148;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar102 [16];
  float fVar149;
  float fVar151;
  float fVar152;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar150;
  float fVar153;
  float fVar154;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar155;
  undefined4 uVar156;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined8 uVar157;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar174;
  float fVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar185;
  undefined1 auVar184 [64];
  float fVar186;
  float fVar191;
  float fVar192;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  uint uVar204;
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  undefined8 local_670;
  undefined8 uStack_668;
  Precalculations *local_660;
  RTCFilterFunctionNArguments local_658;
  long local_628;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [8];
  undefined8 uStack_5c8;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined4 local_4f0;
  undefined4 uStack_4ec;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_410 [16];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  int local_39c;
  undefined1 local_390 [16];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  byte local_350;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  int local_2d0;
  int iStack_2cc;
  int iStack_2c8;
  int iStack_2c4;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined1 local_270 [16];
  uint local_260;
  uint uStack_25c;
  uint uStack_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  uint uStack_248;
  uint uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar9 = prim[1];
  uVar93 = (ulong)(byte)PVar9;
  lVar72 = uVar93 * 0x19;
  fVar186 = *(float *)(prim + lVar72 + 0x12);
  auVar22 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar22 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar99 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar100 = vinsertps_avx(auVar99,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar101 = vsubps_avx(auVar22,*(undefined1 (*) [16])(prim + lVar72 + 6));
  fVar174 = fVar186 * auVar101._0_4_;
  fVar155 = fVar186 * auVar100._0_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar93 * 4 + 6);
  auVar110 = vpmovsxbd_avx2(auVar22);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar93 * 5 + 6);
  auVar108 = vpmovsxbd_avx2(auVar99);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar93 * 6 + 6);
  auVar120 = vpmovsxbd_avx2(auVar98);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar93 * 0xb + 6);
  auVar121 = vpmovsxbd_avx2(auVar96);
  auVar218._8_8_ = 0;
  auVar218._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6);
  auVar117 = vpmovsxbd_avx2(auVar218);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar119 = vcvtdq2ps_avx(auVar117);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (uint)(byte)PVar9 * 0xc + uVar93 + 6);
  auVar109 = vpmovsxbd_avx2(auVar6);
  auVar109 = vcvtdq2ps_avx(auVar109);
  uVar91 = (ulong)(uint)((int)(uVar93 * 9) * 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar91 + 6);
  auVar111 = vpmovsxbd_avx2(auVar7);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar91 + uVar93 + 6);
  auVar112 = vpmovsxbd_avx2(auVar8);
  auVar112 = vcvtdq2ps_avx(auVar112);
  uVar85 = (ulong)(uint)((int)(uVar93 * 5) << 2);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar107 = vpmovsxbd_avx2(auVar97);
  auVar118 = vcvtdq2ps_avx(auVar107);
  auVar210._4_4_ = fVar155;
  auVar210._0_4_ = fVar155;
  auVar210._8_4_ = fVar155;
  auVar210._12_4_ = fVar155;
  auVar210._16_4_ = fVar155;
  auVar210._20_4_ = fVar155;
  auVar210._24_4_ = fVar155;
  auVar210._28_4_ = fVar155;
  auVar212._8_4_ = 1;
  auVar212._0_8_ = 0x100000001;
  auVar212._12_4_ = 1;
  auVar212._16_4_ = 1;
  auVar212._20_4_ = 1;
  auVar212._24_4_ = 1;
  auVar212._28_4_ = 1;
  auVar105 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar114 = ZEXT1632(CONCAT412(fVar186 * auVar100._12_4_,
                                CONCAT48(fVar186 * auVar100._8_4_,
                                         CONCAT44(fVar186 * auVar100._4_4_,fVar155))));
  auVar113 = vpermps_avx2(auVar212,auVar114);
  auVar106 = vpermps_avx512vl(auVar105,auVar114);
  fVar155 = auVar106._0_4_;
  fVar191 = auVar106._4_4_;
  auVar114._4_4_ = fVar191 * auVar120._4_4_;
  auVar114._0_4_ = fVar155 * auVar120._0_4_;
  fVar192 = auVar106._8_4_;
  auVar114._8_4_ = fVar192 * auVar120._8_4_;
  fVar175 = auVar106._12_4_;
  auVar114._12_4_ = fVar175 * auVar120._12_4_;
  fVar185 = auVar106._16_4_;
  auVar114._16_4_ = fVar185 * auVar120._16_4_;
  fVar94 = auVar106._20_4_;
  auVar114._20_4_ = fVar94 * auVar120._20_4_;
  fVar95 = auVar106._24_4_;
  auVar114._24_4_ = fVar95 * auVar120._24_4_;
  auVar114._28_4_ = auVar117._28_4_;
  auVar117._4_4_ = auVar109._4_4_ * fVar191;
  auVar117._0_4_ = auVar109._0_4_ * fVar155;
  auVar117._8_4_ = auVar109._8_4_ * fVar192;
  auVar117._12_4_ = auVar109._12_4_ * fVar175;
  auVar117._16_4_ = auVar109._16_4_ * fVar185;
  auVar117._20_4_ = auVar109._20_4_ * fVar94;
  auVar117._24_4_ = auVar109._24_4_ * fVar95;
  auVar117._28_4_ = auVar107._28_4_;
  auVar107._4_4_ = auVar118._4_4_ * fVar191;
  auVar107._0_4_ = auVar118._0_4_ * fVar155;
  auVar107._8_4_ = auVar118._8_4_ * fVar192;
  auVar107._12_4_ = auVar118._12_4_ * fVar175;
  auVar107._16_4_ = auVar118._16_4_ * fVar185;
  auVar107._20_4_ = auVar118._20_4_ * fVar94;
  auVar107._24_4_ = auVar118._24_4_ * fVar95;
  auVar107._28_4_ = auVar106._28_4_;
  auVar22 = vfmadd231ps_fma(auVar114,auVar113,auVar108);
  auVar99 = vfmadd231ps_fma(auVar117,auVar113,auVar119);
  auVar98 = vfmadd231ps_fma(auVar107,auVar112,auVar113);
  auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar210,auVar110);
  auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar210,auVar121);
  auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar111,auVar210);
  auVar211._4_4_ = fVar174;
  auVar211._0_4_ = fVar174;
  auVar211._8_4_ = fVar174;
  auVar211._12_4_ = fVar174;
  auVar211._16_4_ = fVar174;
  auVar211._20_4_ = fVar174;
  auVar211._24_4_ = fVar174;
  auVar211._28_4_ = fVar174;
  auVar107 = ZEXT1632(CONCAT412(fVar186 * auVar101._12_4_,
                                CONCAT48(fVar186 * auVar101._8_4_,
                                         CONCAT44(fVar186 * auVar101._4_4_,fVar174))));
  auVar117 = vpermps_avx2(auVar212,auVar107);
  auVar107 = vpermps_avx512vl(auVar105,auVar107);
  fVar186 = auVar107._0_4_;
  fVar155 = auVar107._4_4_;
  auVar113._4_4_ = fVar155 * auVar120._4_4_;
  auVar113._0_4_ = fVar186 * auVar120._0_4_;
  fVar191 = auVar107._8_4_;
  auVar113._8_4_ = fVar191 * auVar120._8_4_;
  fVar192 = auVar107._12_4_;
  auVar113._12_4_ = fVar192 * auVar120._12_4_;
  fVar175 = auVar107._16_4_;
  auVar113._16_4_ = fVar175 * auVar120._16_4_;
  fVar185 = auVar107._20_4_;
  auVar113._20_4_ = fVar185 * auVar120._20_4_;
  fVar94 = auVar107._24_4_;
  auVar113._24_4_ = fVar94 * auVar120._24_4_;
  auVar113._28_4_ = 1;
  auVar105._4_4_ = auVar109._4_4_ * fVar155;
  auVar105._0_4_ = auVar109._0_4_ * fVar186;
  auVar105._8_4_ = auVar109._8_4_ * fVar191;
  auVar105._12_4_ = auVar109._12_4_ * fVar192;
  auVar105._16_4_ = auVar109._16_4_ * fVar175;
  auVar105._20_4_ = auVar109._20_4_ * fVar185;
  auVar105._24_4_ = auVar109._24_4_ * fVar94;
  auVar105._28_4_ = auVar120._28_4_;
  auVar109._4_4_ = auVar118._4_4_ * fVar155;
  auVar109._0_4_ = auVar118._0_4_ * fVar186;
  auVar109._8_4_ = auVar118._8_4_ * fVar191;
  auVar109._12_4_ = auVar118._12_4_ * fVar192;
  auVar109._16_4_ = auVar118._16_4_ * fVar175;
  auVar109._20_4_ = auVar118._20_4_ * fVar185;
  auVar109._24_4_ = auVar118._24_4_ * fVar94;
  auVar109._28_4_ = auVar107._28_4_;
  auVar96 = vfmadd231ps_fma(auVar113,auVar117,auVar108);
  auVar218 = vfmadd231ps_fma(auVar105,auVar117,auVar119);
  auVar6 = vfmadd231ps_fma(auVar109,auVar117,auVar112);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar211,auVar110);
  auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar211,auVar121);
  auVar202._8_4_ = 0x7fffffff;
  auVar202._0_8_ = 0x7fffffff7fffffff;
  auVar202._12_4_ = 0x7fffffff;
  auVar202._16_4_ = 0x7fffffff;
  auVar202._20_4_ = 0x7fffffff;
  auVar202._24_4_ = 0x7fffffff;
  auVar202._28_4_ = 0x7fffffff;
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar211,auVar111);
  auVar110 = vandps_avx(ZEXT1632(auVar22),auVar202);
  auVar199._8_4_ = 0x219392ef;
  auVar199._0_8_ = 0x219392ef219392ef;
  auVar199._12_4_ = 0x219392ef;
  auVar199._16_4_ = 0x219392ef;
  auVar199._20_4_ = 0x219392ef;
  auVar199._24_4_ = 0x219392ef;
  auVar199._28_4_ = 0x219392ef;
  uVar91 = vcmpps_avx512vl(auVar110,auVar199,1);
  bVar15 = (bool)((byte)uVar91 & 1);
  auVar106._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar22._0_4_;
  bVar15 = (bool)((byte)(uVar91 >> 1) & 1);
  auVar106._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar22._4_4_;
  bVar15 = (bool)((byte)(uVar91 >> 2) & 1);
  auVar106._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar22._8_4_;
  bVar15 = (bool)((byte)(uVar91 >> 3) & 1);
  auVar106._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar22._12_4_;
  auVar106._16_4_ = (uint)((byte)(uVar91 >> 4) & 1) * 0x219392ef;
  auVar106._20_4_ = (uint)((byte)(uVar91 >> 5) & 1) * 0x219392ef;
  auVar106._24_4_ = (uint)((byte)(uVar91 >> 6) & 1) * 0x219392ef;
  auVar106._28_4_ = (uint)(byte)(uVar91 >> 7) * 0x219392ef;
  auVar110 = vandps_avx(ZEXT1632(auVar99),auVar202);
  uVar91 = vcmpps_avx512vl(auVar110,auVar199,1);
  bVar15 = (bool)((byte)uVar91 & 1);
  auVar115._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar99._0_4_;
  bVar15 = (bool)((byte)(uVar91 >> 1) & 1);
  auVar115._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar99._4_4_;
  bVar15 = (bool)((byte)(uVar91 >> 2) & 1);
  auVar115._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar99._8_4_;
  bVar15 = (bool)((byte)(uVar91 >> 3) & 1);
  auVar115._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar99._12_4_;
  auVar115._16_4_ = (uint)((byte)(uVar91 >> 4) & 1) * 0x219392ef;
  auVar115._20_4_ = (uint)((byte)(uVar91 >> 5) & 1) * 0x219392ef;
  auVar115._24_4_ = (uint)((byte)(uVar91 >> 6) & 1) * 0x219392ef;
  auVar115._28_4_ = (uint)(byte)(uVar91 >> 7) * 0x219392ef;
  auVar110 = vandps_avx(ZEXT1632(auVar98),auVar202);
  uVar91 = vcmpps_avx512vl(auVar110,auVar199,1);
  bVar15 = (bool)((byte)uVar91 & 1);
  auVar110._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar98._0_4_;
  bVar15 = (bool)((byte)(uVar91 >> 1) & 1);
  auVar110._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar98._4_4_;
  bVar15 = (bool)((byte)(uVar91 >> 2) & 1);
  auVar110._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar98._8_4_;
  bVar15 = (bool)((byte)(uVar91 >> 3) & 1);
  auVar110._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar98._12_4_;
  auVar110._16_4_ = (uint)((byte)(uVar91 >> 4) & 1) * 0x219392ef;
  auVar110._20_4_ = (uint)((byte)(uVar91 >> 5) & 1) * 0x219392ef;
  auVar110._24_4_ = (uint)((byte)(uVar91 >> 6) & 1) * 0x219392ef;
  auVar110._28_4_ = (uint)(byte)(uVar91 >> 7) * 0x219392ef;
  auVar108 = vrcp14ps_avx512vl(auVar106);
  auVar200._8_4_ = 0x3f800000;
  auVar200._0_8_ = &DAT_3f8000003f800000;
  auVar200._12_4_ = 0x3f800000;
  auVar200._16_4_ = 0x3f800000;
  auVar200._20_4_ = 0x3f800000;
  auVar200._24_4_ = 0x3f800000;
  auVar200._28_4_ = 0x3f800000;
  auVar22 = vfnmadd213ps_fma(auVar106,auVar108,auVar200);
  auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar108,auVar108);
  auVar108 = vrcp14ps_avx512vl(auVar115);
  auVar99 = vfnmadd213ps_fma(auVar115,auVar108,auVar200);
  auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar108,auVar108);
  auVar108 = vrcp14ps_avx512vl(auVar110);
  auVar98 = vfnmadd213ps_fma(auVar110,auVar108,auVar200);
  auVar98 = vfmadd132ps_fma(ZEXT1632(auVar98),auVar108,auVar108);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 7 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar96));
  auVar111._4_4_ = auVar22._4_4_ * auVar110._4_4_;
  auVar111._0_4_ = auVar22._0_4_ * auVar110._0_4_;
  auVar111._8_4_ = auVar22._8_4_ * auVar110._8_4_;
  auVar111._12_4_ = auVar22._12_4_ * auVar110._12_4_;
  auVar111._16_4_ = auVar110._16_4_ * 0.0;
  auVar111._20_4_ = auVar110._20_4_ * 0.0;
  auVar111._24_4_ = auVar110._24_4_ * 0.0;
  auVar111._28_4_ = auVar110._28_4_;
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 9 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar96));
  auVar109 = vpbroadcastd_avx512vl();
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar9 * 0x10 + 6));
  auVar134._0_4_ = auVar22._0_4_ * auVar110._0_4_;
  auVar134._4_4_ = auVar22._4_4_ * auVar110._4_4_;
  auVar134._8_4_ = auVar22._8_4_ * auVar110._8_4_;
  auVar134._12_4_ = auVar22._12_4_ * auVar110._12_4_;
  auVar134._16_4_ = auVar110._16_4_ * 0.0;
  auVar134._20_4_ = auVar110._20_4_ * 0.0;
  auVar134._24_4_ = auVar110._24_4_ * 0.0;
  auVar134._28_4_ = 0;
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar9 * 0x10 + uVar93 * -2 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar218));
  auVar112._4_4_ = auVar99._4_4_ * auVar110._4_4_;
  auVar112._0_4_ = auVar99._0_4_ * auVar110._0_4_;
  auVar112._8_4_ = auVar99._8_4_ * auVar110._8_4_;
  auVar112._12_4_ = auVar99._12_4_ * auVar110._12_4_;
  auVar112._16_4_ = auVar110._16_4_ * 0.0;
  auVar112._20_4_ = auVar110._20_4_ * 0.0;
  auVar112._24_4_ = auVar110._24_4_ * 0.0;
  auVar112._28_4_ = auVar110._28_4_;
  auVar201 = ZEXT3264(auVar112);
  auVar110 = vcvtdq2ps_avx(auVar108);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar218));
  auVar133._0_4_ = auVar99._0_4_ * auVar110._0_4_;
  auVar133._4_4_ = auVar99._4_4_ * auVar110._4_4_;
  auVar133._8_4_ = auVar99._8_4_ * auVar110._8_4_;
  auVar133._12_4_ = auVar99._12_4_ * auVar110._12_4_;
  auVar133._16_4_ = auVar110._16_4_ * 0.0;
  auVar133._20_4_ = auVar110._20_4_ * 0.0;
  auVar133._24_4_ = auVar110._24_4_ * 0.0;
  auVar133._28_4_ = 0;
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 + uVar93 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar6));
  auVar118._4_4_ = auVar110._4_4_ * auVar98._4_4_;
  auVar118._0_4_ = auVar110._0_4_ * auVar98._0_4_;
  auVar118._8_4_ = auVar110._8_4_ * auVar98._8_4_;
  auVar118._12_4_ = auVar110._12_4_ * auVar98._12_4_;
  auVar118._16_4_ = auVar110._16_4_ * 0.0;
  auVar118._20_4_ = auVar110._20_4_ * 0.0;
  auVar118._24_4_ = auVar110._24_4_ * 0.0;
  auVar118._28_4_ = auVar110._28_4_;
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0x17 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar6));
  auVar116._0_4_ = auVar98._0_4_ * auVar110._0_4_;
  auVar116._4_4_ = auVar98._4_4_ * auVar110._4_4_;
  auVar116._8_4_ = auVar98._8_4_ * auVar110._8_4_;
  auVar116._12_4_ = auVar98._12_4_ * auVar110._12_4_;
  auVar116._16_4_ = auVar110._16_4_ * 0.0;
  auVar116._20_4_ = auVar110._20_4_ * 0.0;
  auVar116._24_4_ = auVar110._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar110 = vpminsd_avx2(auVar111,auVar134);
  auVar108 = vpminsd_avx2(auVar112,auVar133);
  auVar110 = vmaxps_avx(auVar110,auVar108);
  auVar108 = vpminsd_avx2(auVar118,auVar116);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar120._4_4_ = uVar3;
  auVar120._0_4_ = uVar3;
  auVar120._8_4_ = uVar3;
  auVar120._12_4_ = uVar3;
  auVar120._16_4_ = uVar3;
  auVar120._20_4_ = uVar3;
  auVar120._24_4_ = uVar3;
  auVar120._28_4_ = uVar3;
  auVar108 = vmaxps_avx512vl(auVar108,auVar120);
  auVar110 = vmaxps_avx(auVar110,auVar108);
  auVar108._8_4_ = 0x3f7ffffa;
  auVar108._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar108._12_4_ = 0x3f7ffffa;
  auVar108._16_4_ = 0x3f7ffffa;
  auVar108._20_4_ = 0x3f7ffffa;
  auVar108._24_4_ = 0x3f7ffffa;
  auVar108._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar110,auVar108);
  auVar184 = ZEXT3264(local_80);
  auVar110 = vpmaxsd_avx2(auVar111,auVar134);
  auVar108 = vpmaxsd_avx2(auVar112,auVar133);
  auVar110 = vminps_avx(auVar110,auVar108);
  auVar108 = vpmaxsd_avx2(auVar118,auVar116);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar121._4_4_ = uVar3;
  auVar121._0_4_ = uVar3;
  auVar121._8_4_ = uVar3;
  auVar121._12_4_ = uVar3;
  auVar121._16_4_ = uVar3;
  auVar121._20_4_ = uVar3;
  auVar121._24_4_ = uVar3;
  auVar121._28_4_ = uVar3;
  auVar108 = vminps_avx512vl(auVar108,auVar121);
  auVar110 = vminps_avx(auVar110,auVar108);
  auVar119._8_4_ = 0x3f800003;
  auVar119._0_8_ = 0x3f8000033f800003;
  auVar119._12_4_ = 0x3f800003;
  auVar119._16_4_ = 0x3f800003;
  auVar119._20_4_ = 0x3f800003;
  auVar119._24_4_ = 0x3f800003;
  auVar119._28_4_ = 0x3f800003;
  auVar110 = vmulps_avx512vl(auVar110,auVar119);
  uVar23 = vpcmpgtd_avx512vl(auVar109,_DAT_0205a920);
  uVar157 = vcmpps_avx512vl(local_80,auVar110,2);
  if ((byte)((byte)uVar157 & (byte)uVar23) != 0) {
    uVar91 = (ulong)(byte)((byte)uVar157 & (byte)uVar23);
    local_410 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_660 = pre;
    do {
      auVar108 = auVar201._0_32_;
      auVar110 = auVar184._0_32_;
      local_560 = in_ZMM21._0_32_;
      local_540 = in_ZMM20._0_32_;
      lVar24 = 0;
      for (uVar85 = uVar91; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar91 = uVar91 - 1 & uVar91;
      uVar3 = *(undefined4 *)(prim + lVar24 * 4 + 6);
      uVar85 = (ulong)(uint)((int)lVar24 << 6);
      uVar90 = *(uint *)(prim + 2);
      pGVar12 = (context->scene->geometries).items[uVar90].ptr;
      auVar22 = *(undefined1 (*) [16])(prim + uVar85 + lVar72 + 0x16);
      if (uVar91 != 0) {
        uVar88 = uVar91 - 1 & uVar91;
        for (uVar93 = uVar91; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
        }
        if (uVar88 != 0) {
          for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_5b0 = *(undefined1 (*) [16])(prim + uVar85 + lVar72 + 0x26);
      local_5c0 = *(undefined1 (*) [16])(prim + uVar85 + lVar72 + 0x36);
      _local_5d0 = *(undefined1 (*) [16])(prim + uVar85 + lVar72 + 0x46);
      local_4a0 = (uint)pGVar12;
      uStack_49c = (uint)((ulong)pGVar12 >> 0x20);
      iVar10 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar99 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar99 = vinsertps_avx(auVar99,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar96 = vsubps_avx512vl(auVar22,auVar99);
      uVar156 = auVar96._0_4_;
      auVar100._4_4_ = uVar156;
      auVar100._0_4_ = uVar156;
      auVar100._8_4_ = uVar156;
      auVar100._12_4_ = uVar156;
      auVar98 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar186 = pre->ray_space[k].vz.field_0.m128[0];
      fVar155 = pre->ray_space[k].vz.field_0.m128[1];
      fVar191 = pre->ray_space[k].vz.field_0.m128[2];
      fVar192 = pre->ray_space[k].vz.field_0.m128[3];
      auVar205._0_4_ = fVar186 * auVar96._0_4_;
      auVar205._4_4_ = fVar155 * auVar96._4_4_;
      auVar205._8_4_ = fVar191 * auVar96._8_4_;
      auVar205._12_4_ = fVar192 * auVar96._12_4_;
      auVar98 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar5,auVar98);
      auVar218 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar4,auVar100);
      auVar97 = vshufps_avx512vl(auVar22,auVar22,0xff);
      auVar96 = vsubps_avx(local_5b0,auVar99);
      uVar156 = auVar96._0_4_;
      auVar176._4_4_ = uVar156;
      auVar176._0_4_ = uVar156;
      auVar176._8_4_ = uVar156;
      auVar176._12_4_ = uVar156;
      auVar98 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      auVar102._0_4_ = fVar186 * auVar96._0_4_;
      auVar102._4_4_ = fVar155 * auVar96._4_4_;
      auVar102._8_4_ = fVar191 * auVar96._8_4_;
      auVar102._12_4_ = fVar192 * auVar96._12_4_;
      auVar98 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar5,auVar98);
      auVar6 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar4,auVar176);
      auVar96 = vsubps_avx512vl(local_5c0,auVar99);
      uVar156 = auVar96._0_4_;
      auVar177._4_4_ = uVar156;
      auVar177._0_4_ = uVar156;
      auVar177._8_4_ = uVar156;
      auVar177._12_4_ = uVar156;
      auVar98 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      auVar207._0_4_ = fVar186 * auVar96._0_4_;
      auVar207._4_4_ = fVar155 * auVar96._4_4_;
      auVar207._8_4_ = fVar191 * auVar96._8_4_;
      auVar207._12_4_ = fVar192 * auVar96._12_4_;
      auVar98 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar5,auVar98);
      auVar96 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar4,auVar177);
      auVar98 = vsubps_avx512vl(_local_5d0,auVar99);
      uVar156 = auVar98._0_4_;
      auVar101._4_4_ = uVar156;
      auVar101._0_4_ = uVar156;
      auVar101._8_4_ = uVar156;
      auVar101._12_4_ = uVar156;
      auVar99 = vshufps_avx(auVar98,auVar98,0x55);
      auVar98 = vshufps_avx(auVar98,auVar98,0xaa);
      auVar208._0_4_ = fVar186 * auVar98._0_4_;
      auVar208._4_4_ = fVar155 * auVar98._4_4_;
      auVar208._8_4_ = fVar191 * auVar98._8_4_;
      auVar208._12_4_ = fVar192 * auVar98._12_4_;
      auVar99 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar5,auVar99);
      auVar7 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar4,auVar101);
      lVar24 = (long)iVar10 * 0x44;
      auVar120 = *(undefined1 (*) [32])(bezier_basis0 + lVar24);
      uVar156 = auVar218._0_4_;
      local_460._4_4_ = uVar156;
      local_460._0_4_ = uVar156;
      local_460._8_4_ = uVar156;
      local_460._12_4_ = uVar156;
      local_460._16_4_ = uVar156;
      local_460._20_4_ = uVar156;
      local_460._24_4_ = uVar156;
      local_460._28_4_ = uVar156;
      auVar169._8_4_ = 1;
      auVar169._0_8_ = 0x100000001;
      auVar169._12_4_ = 1;
      auVar169._16_4_ = 1;
      auVar169._20_4_ = 1;
      auVar169._24_4_ = 1;
      auVar169._28_4_ = 1;
      local_600 = vpermps_avx512vl(auVar169,ZEXT1632(auVar218));
      auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x484);
      local_620 = vbroadcastss_avx512vl(auVar6);
      local_200 = vpermps_avx2(auVar169,ZEXT1632(auVar6));
      auVar119 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x908);
      local_a0 = vbroadcastss_avx512vl(auVar96);
      local_c0 = vpermps_avx512vl(auVar169,ZEXT1632(auVar96));
      auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0xd8c);
      local_580 = vbroadcastss_avx512vl(auVar7);
      auVar220 = ZEXT3264(local_580);
      local_5a0 = vpermps_avx512vl(auVar169,ZEXT1632(auVar7));
      auVar221 = ZEXT3264(local_5a0);
      auVar111 = vmulps_avx512vl(local_580,auVar109);
      auVar112 = vmulps_avx512vl(local_5a0,auVar109);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar119,local_a0);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar119,local_c0);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar121,local_620);
      auVar99 = vfmadd231ps_fma(auVar112,auVar121,local_200);
      auVar107 = vfmadd231ps_avx512vl(auVar111,auVar120,local_460);
      auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar120,local_600);
      auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar24);
      auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x484);
      auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x908);
      auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0xd8c);
      auVar114 = vmulps_avx512vl(local_580,auVar117);
      auVar105 = vmulps_avx512vl(local_5a0,auVar117);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar118,local_a0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar118,local_c0);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar112,local_620);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar112,local_200);
      auVar8 = vfmadd231ps_fma(auVar114,auVar111,local_460);
      auVar114 = vfmadd231ps_avx512vl(auVar105,auVar111,local_600);
      local_440 = vsubps_avx512vl(ZEXT1632(auVar8),auVar107);
      local_480 = vsubps_avx(auVar114,auVar113);
      auVar105 = vmulps_avx512vl(auVar113,local_440);
      auVar106 = vmulps_avx512vl(auVar107,local_480);
      auVar105 = vsubps_avx512vl(auVar105,auVar106);
      auVar99 = vshufps_avx(local_5b0,local_5b0,0xff);
      uVar157 = auVar97._0_8_;
      local_e0._8_8_ = uVar157;
      local_e0._0_8_ = uVar157;
      local_e0._16_8_ = uVar157;
      local_e0._24_8_ = uVar157;
      local_100 = vbroadcastsd_avx512vl(auVar99);
      auVar99 = vshufps_avx512vl(local_5c0,local_5c0,0xff);
      local_120 = vbroadcastsd_avx512vl(auVar99);
      auVar99 = vshufps_avx512vl(_local_5d0,_local_5d0,0xff);
      uVar157 = auVar99._0_8_;
      register0x00001248 = uVar157;
      local_140 = uVar157;
      register0x00001250 = uVar157;
      register0x00001258 = uVar157;
      auVar106 = vmulps_avx512vl(_local_140,auVar109);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar119,local_120);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar121,local_100);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar120,local_e0);
      auVar115 = vmulps_avx512vl(_local_140,auVar117);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar118,local_120);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar112,local_100);
      auVar97 = vfmadd231ps_fma(auVar115,auVar111,local_e0);
      auVar115 = vmulps_avx512vl(local_480,local_480);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_440,local_440);
      auVar116 = vmaxps_avx512vl(auVar106,ZEXT1632(auVar97));
      auVar116 = vmulps_avx512vl(auVar116,auVar116);
      auVar115 = vmulps_avx512vl(auVar116,auVar115);
      auVar105 = vmulps_avx512vl(auVar105,auVar105);
      uVar157 = vcmpps_avx512vl(auVar105,auVar115,2);
      auVar99 = vblendps_avx(auVar218,auVar22,8);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar98 = vandps_avx512vl(auVar99,auVar100);
      auVar99 = vblendps_avx(auVar6,local_5b0,8);
      auVar99 = vandps_avx512vl(auVar99,auVar100);
      auVar98 = vmaxps_avx(auVar98,auVar99);
      auVar99 = vblendps_avx(auVar96,local_5c0,8);
      auVar101 = vandps_avx512vl(auVar99,auVar100);
      auVar99 = vblendps_avx(auVar7,_local_5d0,8);
      auVar99 = vandps_avx512vl(auVar99,auVar100);
      auVar99 = vmaxps_avx(auVar101,auVar99);
      auVar99 = vmaxps_avx(auVar98,auVar99);
      auVar98 = vmovshdup_avx(auVar99);
      auVar98 = vmaxss_avx(auVar98,auVar99);
      auVar99 = vshufpd_avx(auVar99,auVar99,1);
      auVar99 = vmaxss_avx(auVar99,auVar98);
      local_5e0 = vcvtsi2ss_avx512f(_local_5d0,iVar10);
      auVar209._0_4_ = local_5e0._0_4_;
      auVar209._4_4_ = auVar209._0_4_;
      auVar209._8_4_ = auVar209._0_4_;
      auVar209._12_4_ = auVar209._0_4_;
      auVar209._16_4_ = auVar209._0_4_;
      auVar209._20_4_ = auVar209._0_4_;
      auVar209._24_4_ = auVar209._0_4_;
      auVar209._28_4_ = auVar209._0_4_;
      uVar23 = vcmpps_avx512vl(auVar209,_DAT_02020f40,0xe);
      bVar92 = (byte)uVar157 & (byte)uVar23;
      auVar99 = vmulss_avx512f(auVar99,ZEXT416(0x35000000));
      auVar182._8_4_ = 2;
      auVar182._0_8_ = 0x200000002;
      auVar182._12_4_ = 2;
      auVar182._16_4_ = 2;
      auVar182._20_4_ = 2;
      auVar182._24_4_ = 2;
      auVar182._28_4_ = 2;
      local_160 = vpermps_avx512vl(auVar182,ZEXT1632(auVar218));
      local_180 = vpermps_avx512vl(auVar182,ZEXT1632(auVar6));
      local_1a0 = vpermps_avx512vl(auVar182,ZEXT1632(auVar96));
      local_1c0 = vpermps_avx2(auVar182,ZEXT1632(auVar7));
      uVar204 = *(uint *)(ray + k * 4 + 0x30);
      if (bVar92 == 0) {
        auVar98 = vxorps_avx512vl(_local_5d0,_local_5d0);
        auVar219 = ZEXT1664(auVar98);
        auVar201 = ZEXT3264(auVar108);
        in_ZMM20 = ZEXT3264(local_540);
        auVar184 = ZEXT3264(auVar110);
        in_ZMM21 = ZEXT3264(local_560);
        auVar217 = ZEXT3264(local_460);
        auVar215 = ZEXT3264(local_600);
        auVar216 = ZEXT3264(local_620);
      }
      else {
        _local_4c0 = ZEXT416(uVar204);
        auVar117 = vmulps_avx512vl(local_1c0,auVar117);
        auVar118 = vfmadd213ps_avx512vl(auVar118,local_1a0,auVar117);
        auVar112 = vfmadd213ps_avx512vl(auVar112,local_180,auVar118);
        auVar112 = vfmadd213ps_avx512vl(auVar111,local_160,auVar112);
        auVar109 = vmulps_avx512vl(local_1c0,auVar109);
        auVar119 = vfmadd213ps_avx512vl(auVar119,local_1a0,auVar109);
        auVar118 = vfmadd213ps_avx512vl(auVar121,local_180,auVar119);
        auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1210);
        auVar119 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1694);
        auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1b18);
        auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1f9c);
        auVar118 = vfmadd213ps_avx512vl(auVar120,local_160,auVar118);
        auVar120 = vmulps_avx512vl(local_580,auVar111);
        auVar117 = vmulps_avx512vl(local_5a0,auVar111);
        auVar111 = vmulps_avx512vl(local_1c0,auVar111);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar109,local_a0);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar109,local_c0);
        auVar109 = vfmadd231ps_avx512vl(auVar111,local_1a0,auVar109);
        auVar216 = ZEXT3264(local_620);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar119,local_620);
        auVar98 = vfmadd231ps_fma(auVar117,auVar119,local_200);
        auVar111 = vfmadd231ps_avx512vl(auVar109,local_180,auVar119);
        auVar117 = vfmadd231ps_avx512vl(auVar120,auVar121,local_460);
        auVar215 = ZEXT3264(local_600);
        auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),auVar121,local_600);
        auVar120 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1210);
        auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1b18);
        auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1f9c);
        auVar111 = vfmadd231ps_avx512vl(auVar111,local_160,auVar121);
        auVar121 = vmulps_avx512vl(local_580,auVar109);
        auVar115 = vmulps_avx512vl(local_5a0,auVar109);
        auVar109 = vmulps_avx512vl(local_1c0,auVar109);
        auVar116 = vfmadd231ps_avx512vl(auVar121,auVar119,local_a0);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar119,local_c0);
        auVar119 = vfmadd231ps_avx512vl(auVar109,local_1a0,auVar119);
        auVar121 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1694);
        auVar109 = vfmadd231ps_avx512vl(auVar116,auVar121,local_620);
        auVar98 = vfmadd231ps_fma(auVar115,auVar121,local_200);
        auVar121 = vfmadd231ps_avx512vl(auVar119,local_180,auVar121);
        auVar119 = vfmadd231ps_avx512vl(auVar109,auVar120,local_460);
        auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),auVar120,local_600);
        auVar115 = vfmadd231ps_avx512vl(auVar121,local_160,auVar120);
        auVar213._8_4_ = 0x7fffffff;
        auVar213._0_8_ = 0x7fffffff7fffffff;
        auVar213._12_4_ = 0x7fffffff;
        auVar213._16_4_ = 0x7fffffff;
        auVar213._20_4_ = 0x7fffffff;
        auVar213._24_4_ = 0x7fffffff;
        auVar213._28_4_ = 0x7fffffff;
        auVar120 = vandps_avx(auVar117,auVar213);
        auVar121 = vandps_avx(auVar105,auVar213);
        auVar121 = vmaxps_avx(auVar120,auVar121);
        auVar120 = vandps_avx(auVar111,auVar213);
        auVar120 = vmaxps_avx(auVar121,auVar120);
        auVar111 = vbroadcastss_avx512vl(auVar99);
        uVar85 = vcmpps_avx512vl(auVar120,auVar111,1);
        bVar15 = (bool)((byte)uVar85 & 1);
        auVar122._0_4_ = (float)((uint)bVar15 * local_440._0_4_ | (uint)!bVar15 * auVar117._0_4_);
        bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar15 * local_440._4_4_ | (uint)!bVar15 * auVar117._4_4_);
        bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar15 * local_440._8_4_ | (uint)!bVar15 * auVar117._8_4_);
        bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar15 * local_440._12_4_ | (uint)!bVar15 * auVar117._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar122._16_4_ = (float)((uint)bVar15 * local_440._16_4_ | (uint)!bVar15 * auVar117._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar122._20_4_ = (float)((uint)bVar15 * local_440._20_4_ | (uint)!bVar15 * auVar117._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar122._24_4_ = (float)((uint)bVar15 * local_440._24_4_ | (uint)!bVar15 * auVar117._24_4_)
        ;
        bVar15 = SUB81(uVar85 >> 7,0);
        auVar122._28_4_ = (uint)bVar15 * local_440._28_4_ | (uint)!bVar15 * auVar117._28_4_;
        bVar15 = (bool)((byte)uVar85 & 1);
        auVar123._0_4_ = (float)((uint)bVar15 * local_480._0_4_ | (uint)!bVar15 * auVar105._0_4_);
        bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar15 * local_480._4_4_ | (uint)!bVar15 * auVar105._4_4_);
        bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar15 * local_480._8_4_ | (uint)!bVar15 * auVar105._8_4_);
        bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar15 * local_480._12_4_ | (uint)!bVar15 * auVar105._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar15 * local_480._16_4_ | (uint)!bVar15 * auVar105._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar15 * local_480._20_4_ | (uint)!bVar15 * auVar105._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar15 * local_480._24_4_ | (uint)!bVar15 * auVar105._24_4_)
        ;
        bVar15 = SUB81(uVar85 >> 7,0);
        auVar123._28_4_ = (uint)bVar15 * local_480._28_4_ | (uint)!bVar15 * auVar105._28_4_;
        auVar120 = vandps_avx(auVar213,auVar119);
        auVar121 = vandps_avx(auVar109,auVar213);
        auVar121 = vmaxps_avx(auVar120,auVar121);
        auVar120 = vandps_avx(auVar115,auVar213);
        auVar120 = vmaxps_avx(auVar121,auVar120);
        uVar85 = vcmpps_avx512vl(auVar120,auVar111,1);
        bVar15 = (bool)((byte)uVar85 & 1);
        auVar124._0_4_ = (float)((uint)bVar15 * local_440._0_4_ | (uint)!bVar15 * auVar119._0_4_);
        bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar15 * local_440._4_4_ | (uint)!bVar15 * auVar119._4_4_);
        bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar15 * local_440._8_4_ | (uint)!bVar15 * auVar119._8_4_);
        bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar15 * local_440._12_4_ | (uint)!bVar15 * auVar119._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar124._16_4_ = (float)((uint)bVar15 * local_440._16_4_ | (uint)!bVar15 * auVar119._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar124._20_4_ = (float)((uint)bVar15 * local_440._20_4_ | (uint)!bVar15 * auVar119._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar124._24_4_ = (float)((uint)bVar15 * local_440._24_4_ | (uint)!bVar15 * auVar119._24_4_)
        ;
        bVar15 = SUB81(uVar85 >> 7,0);
        auVar124._28_4_ = (uint)bVar15 * local_440._28_4_ | (uint)!bVar15 * auVar119._28_4_;
        bVar15 = (bool)((byte)uVar85 & 1);
        auVar125._0_4_ = (float)((uint)bVar15 * local_480._0_4_ | (uint)!bVar15 * auVar109._0_4_);
        bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar15 * local_480._4_4_ | (uint)!bVar15 * auVar109._4_4_);
        bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar15 * local_480._8_4_ | (uint)!bVar15 * auVar109._8_4_);
        bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar15 * local_480._12_4_ | (uint)!bVar15 * auVar109._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar125._16_4_ = (float)((uint)bVar15 * local_480._16_4_ | (uint)!bVar15 * auVar109._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar125._20_4_ = (float)((uint)bVar15 * local_480._20_4_ | (uint)!bVar15 * auVar109._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar125._24_4_ = (float)((uint)bVar15 * local_480._24_4_ | (uint)!bVar15 * auVar109._24_4_)
        ;
        bVar15 = SUB81(uVar85 >> 7,0);
        auVar125._28_4_ = (uint)bVar15 * local_480._28_4_ | (uint)!bVar15 * auVar109._28_4_;
        auVar102 = vxorps_avx512vl(_local_5d0,_local_5d0);
        auVar219 = ZEXT1664(auVar102);
        auVar120 = vfmadd213ps_avx512vl(auVar122,auVar122,ZEXT1632(auVar102));
        auVar98 = vfmadd231ps_fma(auVar120,auVar123,auVar123);
        auVar120 = vrsqrt14ps_avx512vl(ZEXT1632(auVar98));
        fVar186 = auVar120._0_4_;
        fVar155 = auVar120._4_4_;
        fVar191 = auVar120._8_4_;
        fVar192 = auVar120._12_4_;
        fVar175 = auVar120._16_4_;
        fVar185 = auVar120._20_4_;
        fVar94 = auVar120._24_4_;
        auVar36._4_4_ = fVar155 * fVar155 * fVar155 * auVar98._4_4_ * -0.5;
        auVar36._0_4_ = fVar186 * fVar186 * fVar186 * auVar98._0_4_ * -0.5;
        auVar36._8_4_ = fVar191 * fVar191 * fVar191 * auVar98._8_4_ * -0.5;
        auVar36._12_4_ = fVar192 * fVar192 * fVar192 * auVar98._12_4_ * -0.5;
        auVar36._16_4_ = fVar175 * fVar175 * fVar175 * -0.0;
        auVar36._20_4_ = fVar185 * fVar185 * fVar185 * -0.0;
        auVar36._24_4_ = fVar94 * fVar94 * fVar94 * -0.0;
        auVar36._28_4_ = 0;
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar119 = vfmadd231ps_avx512vl(auVar36,auVar121,auVar120);
        auVar37._4_4_ = auVar123._4_4_ * auVar119._4_4_;
        auVar37._0_4_ = auVar123._0_4_ * auVar119._0_4_;
        auVar37._8_4_ = auVar123._8_4_ * auVar119._8_4_;
        auVar37._12_4_ = auVar123._12_4_ * auVar119._12_4_;
        auVar37._16_4_ = auVar123._16_4_ * auVar119._16_4_;
        auVar37._20_4_ = auVar123._20_4_ * auVar119._20_4_;
        auVar37._24_4_ = auVar123._24_4_ * auVar119._24_4_;
        auVar37._28_4_ = auVar120._28_4_;
        auVar38._4_4_ = auVar119._4_4_ * -auVar122._4_4_;
        auVar38._0_4_ = auVar119._0_4_ * -auVar122._0_4_;
        auVar38._8_4_ = auVar119._8_4_ * -auVar122._8_4_;
        auVar38._12_4_ = auVar119._12_4_ * -auVar122._12_4_;
        auVar38._16_4_ = auVar119._16_4_ * -auVar122._16_4_;
        auVar38._20_4_ = auVar119._20_4_ * -auVar122._20_4_;
        auVar38._24_4_ = auVar119._24_4_ * -auVar122._24_4_;
        auVar38._28_4_ = auVar122._28_4_ ^ 0x80000000;
        auVar120 = vmulps_avx512vl(auVar119,ZEXT1632(auVar102));
        auVar105 = ZEXT1632(auVar102);
        auVar109 = vfmadd213ps_avx512vl(auVar124,auVar124,auVar105);
        auVar98 = vfmadd231ps_fma(auVar109,auVar125,auVar125);
        auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar98));
        fVar186 = auVar109._0_4_;
        fVar155 = auVar109._4_4_;
        fVar191 = auVar109._8_4_;
        fVar192 = auVar109._12_4_;
        fVar175 = auVar109._16_4_;
        fVar185 = auVar109._20_4_;
        fVar94 = auVar109._24_4_;
        auVar39._4_4_ = fVar155 * fVar155 * fVar155 * auVar98._4_4_ * -0.5;
        auVar39._0_4_ = fVar186 * fVar186 * fVar186 * auVar98._0_4_ * -0.5;
        auVar39._8_4_ = fVar191 * fVar191 * fVar191 * auVar98._8_4_ * -0.5;
        auVar39._12_4_ = fVar192 * fVar192 * fVar192 * auVar98._12_4_ * -0.5;
        auVar39._16_4_ = fVar175 * fVar175 * fVar175 * -0.0;
        auVar39._20_4_ = fVar185 * fVar185 * fVar185 * -0.0;
        auVar39._24_4_ = fVar94 * fVar94 * fVar94 * -0.0;
        auVar39._28_4_ = 0;
        auVar121 = vfmadd231ps_avx512vl(auVar39,auVar121,auVar109);
        auVar40._4_4_ = auVar125._4_4_ * auVar121._4_4_;
        auVar40._0_4_ = auVar125._0_4_ * auVar121._0_4_;
        auVar40._8_4_ = auVar125._8_4_ * auVar121._8_4_;
        auVar40._12_4_ = auVar125._12_4_ * auVar121._12_4_;
        auVar40._16_4_ = auVar125._16_4_ * auVar121._16_4_;
        auVar40._20_4_ = auVar125._20_4_ * auVar121._20_4_;
        auVar40._24_4_ = auVar125._24_4_ * auVar121._24_4_;
        auVar40._28_4_ = auVar109._28_4_;
        auVar41._4_4_ = -auVar124._4_4_ * auVar121._4_4_;
        auVar41._0_4_ = -auVar124._0_4_ * auVar121._0_4_;
        auVar41._8_4_ = -auVar124._8_4_ * auVar121._8_4_;
        auVar41._12_4_ = -auVar124._12_4_ * auVar121._12_4_;
        auVar41._16_4_ = -auVar124._16_4_ * auVar121._16_4_;
        auVar41._20_4_ = -auVar124._20_4_ * auVar121._20_4_;
        auVar41._24_4_ = -auVar124._24_4_ * auVar121._24_4_;
        auVar41._28_4_ = auVar119._28_4_;
        auVar121 = vmulps_avx512vl(auVar121,auVar105);
        auVar98 = vfmadd213ps_fma(auVar37,auVar106,auVar107);
        auVar96 = vfmadd213ps_fma(auVar38,auVar106,auVar113);
        auVar119 = vfmadd213ps_avx512vl(auVar120,auVar106,auVar118);
        auVar109 = vfmadd213ps_avx512vl(auVar40,ZEXT1632(auVar97),ZEXT1632(auVar8));
        auVar100 = vfnmadd213ps_fma(auVar37,auVar106,auVar107);
        auVar117 = ZEXT1632(auVar97);
        auVar218 = vfmadd213ps_fma(auVar41,auVar117,auVar114);
        auVar101 = vfnmadd213ps_fma(auVar38,auVar106,auVar113);
        auVar6 = vfmadd213ps_fma(auVar121,auVar117,auVar112);
        auVar111 = vfnmadd231ps_avx512vl(auVar118,auVar106,auVar120);
        auVar176 = vfnmadd213ps_fma(auVar40,auVar117,ZEXT1632(auVar8));
        auVar177 = vfnmadd213ps_fma(auVar41,auVar117,auVar114);
        auVar205 = vfnmadd231ps_fma(auVar112,ZEXT1632(auVar97),auVar121);
        auVar121 = vsubps_avx512vl(auVar109,ZEXT1632(auVar100));
        auVar120 = vsubps_avx(ZEXT1632(auVar218),ZEXT1632(auVar101));
        auVar112 = vsubps_avx512vl(ZEXT1632(auVar6),auVar111);
        auVar118 = vmulps_avx512vl(auVar120,auVar111);
        auVar7 = vfmsub231ps_fma(auVar118,ZEXT1632(auVar101),auVar112);
        auVar42._4_4_ = auVar100._4_4_ * auVar112._4_4_;
        auVar42._0_4_ = auVar100._0_4_ * auVar112._0_4_;
        auVar42._8_4_ = auVar100._8_4_ * auVar112._8_4_;
        auVar42._12_4_ = auVar100._12_4_ * auVar112._12_4_;
        auVar42._16_4_ = auVar112._16_4_ * 0.0;
        auVar42._20_4_ = auVar112._20_4_ * 0.0;
        auVar42._24_4_ = auVar112._24_4_ * 0.0;
        auVar42._28_4_ = auVar112._28_4_;
        auVar112 = vfmsub231ps_avx512vl(auVar42,auVar111,auVar121);
        auVar43._4_4_ = auVar101._4_4_ * auVar121._4_4_;
        auVar43._0_4_ = auVar101._0_4_ * auVar121._0_4_;
        auVar43._8_4_ = auVar101._8_4_ * auVar121._8_4_;
        auVar43._12_4_ = auVar101._12_4_ * auVar121._12_4_;
        auVar43._16_4_ = auVar121._16_4_ * 0.0;
        auVar43._20_4_ = auVar121._20_4_ * 0.0;
        auVar43._24_4_ = auVar121._24_4_ * 0.0;
        auVar43._28_4_ = auVar121._28_4_;
        auVar8 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar100),auVar120);
        auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar105,auVar112);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar105,ZEXT1632(auVar7));
        auVar105 = ZEXT1632(auVar102);
        uVar85 = vcmpps_avx512vl(auVar120,auVar105,2);
        bVar84 = (byte)uVar85;
        fVar94 = (float)((uint)(bVar84 & 1) * auVar98._0_4_ |
                        (uint)!(bool)(bVar84 & 1) * auVar176._0_4_);
        bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
        fVar174 = (float)((uint)bVar15 * auVar98._4_4_ | (uint)!bVar15 * auVar176._4_4_);
        bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
        fVar148 = (float)((uint)bVar15 * auVar98._8_4_ | (uint)!bVar15 * auVar176._8_4_);
        bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
        fVar151 = (float)((uint)bVar15 * auVar98._12_4_ | (uint)!bVar15 * auVar176._12_4_);
        auVar118 = ZEXT1632(CONCAT412(fVar151,CONCAT48(fVar148,CONCAT44(fVar174,fVar94))));
        fVar95 = (float)((uint)(bVar84 & 1) * auVar96._0_4_ |
                        (uint)!(bool)(bVar84 & 1) * auVar177._0_4_);
        bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
        fVar147 = (float)((uint)bVar15 * auVar96._4_4_ | (uint)!bVar15 * auVar177._4_4_);
        bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
        fVar149 = (float)((uint)bVar15 * auVar96._8_4_ | (uint)!bVar15 * auVar177._8_4_);
        bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
        fVar152 = (float)((uint)bVar15 * auVar96._12_4_ | (uint)!bVar15 * auVar177._12_4_);
        auVar117 = ZEXT1632(CONCAT412(fVar152,CONCAT48(fVar149,CONCAT44(fVar147,fVar95))));
        auVar126._0_4_ =
             (float)((uint)(bVar84 & 1) * auVar119._0_4_ |
                    (uint)!(bool)(bVar84 & 1) * auVar205._0_4_);
        bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar15 * auVar119._4_4_ | (uint)!bVar15 * auVar205._4_4_);
        bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar15 * auVar119._8_4_ | (uint)!bVar15 * auVar205._8_4_);
        bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar15 * auVar119._12_4_ | (uint)!bVar15 * auVar205._12_4_);
        fVar186 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar119._16_4_);
        auVar126._16_4_ = fVar186;
        fVar191 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar119._20_4_);
        auVar126._20_4_ = fVar191;
        fVar155 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar119._24_4_);
        auVar126._24_4_ = fVar155;
        iVar1 = (uint)(byte)(uVar85 >> 7) * auVar119._28_4_;
        auVar126._28_4_ = iVar1;
        auVar121 = vblendmps_avx512vl(ZEXT1632(auVar100),auVar109);
        auVar127._0_4_ =
             (uint)(bVar84 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar7._0_4_;
        bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar15 * auVar121._4_4_ | (uint)!bVar15 * auVar7._4_4_;
        bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar15 * auVar121._8_4_ | (uint)!bVar15 * auVar7._8_4_;
        bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar15 * auVar121._12_4_ | (uint)!bVar15 * auVar7._12_4_;
        auVar127._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * auVar121._16_4_;
        auVar127._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * auVar121._20_4_;
        auVar127._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * auVar121._24_4_;
        auVar127._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar121._28_4_;
        auVar121 = vblendmps_avx512vl(ZEXT1632(auVar101),ZEXT1632(auVar218));
        auVar128._0_4_ =
             (float)((uint)(bVar84 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar96._0_4_
                    );
        bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar15 * auVar121._4_4_ | (uint)!bVar15 * auVar96._4_4_);
        bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar15 * auVar121._8_4_ | (uint)!bVar15 * auVar96._8_4_);
        bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar15 * auVar121._12_4_ | (uint)!bVar15 * auVar96._12_4_);
        fVar192 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar121._16_4_);
        auVar128._16_4_ = fVar192;
        fVar175 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar121._20_4_);
        auVar128._20_4_ = fVar175;
        fVar185 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar121._24_4_);
        auVar128._24_4_ = fVar185;
        auVar128._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar121._28_4_;
        auVar121 = vblendmps_avx512vl(auVar111,ZEXT1632(auVar6));
        auVar129._0_4_ =
             (float)((uint)(bVar84 & 1) * auVar121._0_4_ |
                    (uint)!(bool)(bVar84 & 1) * auVar119._0_4_);
        bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar15 * auVar121._4_4_ | (uint)!bVar15 * auVar119._4_4_);
        bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar15 * auVar121._8_4_ | (uint)!bVar15 * auVar119._8_4_);
        bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar15 * auVar121._12_4_ | (uint)!bVar15 * auVar119._12_4_);
        bVar15 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar129._16_4_ = (float)((uint)bVar15 * auVar121._16_4_ | (uint)!bVar15 * auVar119._16_4_);
        bVar15 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar129._20_4_ = (float)((uint)bVar15 * auVar121._20_4_ | (uint)!bVar15 * auVar119._20_4_);
        bVar15 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar129._24_4_ = (float)((uint)bVar15 * auVar121._24_4_ | (uint)!bVar15 * auVar119._24_4_);
        bVar15 = SUB81(uVar85 >> 7,0);
        auVar129._28_4_ = (uint)bVar15 * auVar121._28_4_ | (uint)!bVar15 * auVar119._28_4_;
        auVar130._0_4_ =
             (uint)(bVar84 & 1) * (int)auVar100._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar109._0_4_;
        bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar15 * (int)auVar100._4_4_ | (uint)!bVar15 * auVar109._4_4_;
        bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar15 * (int)auVar100._8_4_ | (uint)!bVar15 * auVar109._8_4_;
        bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar15 * (int)auVar100._12_4_ | (uint)!bVar15 * auVar109._12_4_;
        auVar130._16_4_ = (uint)!(bool)((byte)(uVar85 >> 4) & 1) * auVar109._16_4_;
        auVar130._20_4_ = (uint)!(bool)((byte)(uVar85 >> 5) & 1) * auVar109._20_4_;
        auVar130._24_4_ = (uint)!(bool)((byte)(uVar85 >> 6) & 1) * auVar109._24_4_;
        auVar130._28_4_ = (uint)!SUB81(uVar85 >> 7,0) * auVar109._28_4_;
        bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar85 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar131._0_4_ =
             (uint)(bVar84 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar6._0_4_;
        bVar16 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar16 * auVar111._4_4_ | (uint)!bVar16 * auVar6._4_4_;
        bVar16 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar16 * auVar111._8_4_ | (uint)!bVar16 * auVar6._8_4_;
        bVar16 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar16 * auVar111._12_4_ | (uint)!bVar16 * auVar6._12_4_;
        auVar131._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * auVar111._16_4_;
        auVar131._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * auVar111._20_4_;
        auVar131._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * auVar111._24_4_;
        iVar2 = (uint)(byte)(uVar85 >> 7) * auVar111._28_4_;
        auVar131._28_4_ = iVar2;
        auVar107 = vsubps_avx512vl(auVar130,auVar118);
        auVar121 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar101._12_4_ |
                                                 (uint)!bVar18 * auVar218._12_4_,
                                                 CONCAT48((uint)bVar17 * (int)auVar101._8_4_ |
                                                          (uint)!bVar17 * auVar218._8_4_,
                                                          CONCAT44((uint)bVar15 *
                                                                   (int)auVar101._4_4_ |
                                                                   (uint)!bVar15 * auVar218._4_4_,
                                                                   (uint)(bVar84 & 1) *
                                                                   (int)auVar101._0_4_ |
                                                                   (uint)!(bool)(bVar84 & 1) *
                                                                   auVar218._0_4_)))),auVar117);
        auVar119 = vsubps_avx(auVar131,auVar126);
        auVar109 = vsubps_avx(auVar118,auVar127);
        auVar111 = vsubps_avx(auVar117,auVar128);
        auVar112 = vsubps_avx(auVar126,auVar129);
        auVar44._4_4_ = auVar119._4_4_ * fVar174;
        auVar44._0_4_ = auVar119._0_4_ * fVar94;
        auVar44._8_4_ = auVar119._8_4_ * fVar148;
        auVar44._12_4_ = auVar119._12_4_ * fVar151;
        auVar44._16_4_ = auVar119._16_4_ * 0.0;
        auVar44._20_4_ = auVar119._20_4_ * 0.0;
        auVar44._24_4_ = auVar119._24_4_ * 0.0;
        auVar44._28_4_ = iVar2;
        auVar98 = vfmsub231ps_fma(auVar44,auVar126,auVar107);
        auVar45._4_4_ = fVar147 * auVar107._4_4_;
        auVar45._0_4_ = fVar95 * auVar107._0_4_;
        auVar45._8_4_ = fVar149 * auVar107._8_4_;
        auVar45._12_4_ = fVar152 * auVar107._12_4_;
        auVar45._16_4_ = auVar107._16_4_ * 0.0;
        auVar45._20_4_ = auVar107._20_4_ * 0.0;
        auVar45._24_4_ = auVar107._24_4_ * 0.0;
        auVar45._28_4_ = auVar120._28_4_;
        auVar96 = vfmsub231ps_fma(auVar45,auVar118,auVar121);
        auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar105,ZEXT1632(auVar98));
        auVar187._0_4_ = auVar121._0_4_ * auVar126._0_4_;
        auVar187._4_4_ = auVar121._4_4_ * auVar126._4_4_;
        auVar187._8_4_ = auVar121._8_4_ * auVar126._8_4_;
        auVar187._12_4_ = auVar121._12_4_ * auVar126._12_4_;
        auVar187._16_4_ = auVar121._16_4_ * fVar186;
        auVar187._20_4_ = auVar121._20_4_ * fVar191;
        auVar187._24_4_ = auVar121._24_4_ * fVar155;
        auVar187._28_4_ = 0;
        auVar98 = vfmsub231ps_fma(auVar187,auVar117,auVar119);
        auVar113 = vfmadd231ps_avx512vl(auVar120,auVar105,ZEXT1632(auVar98));
        auVar120 = vmulps_avx512vl(auVar112,auVar127);
        auVar120 = vfmsub231ps_avx512vl(auVar120,auVar109,auVar129);
        auVar46._4_4_ = auVar111._4_4_ * auVar129._4_4_;
        auVar46._0_4_ = auVar111._0_4_ * auVar129._0_4_;
        auVar46._8_4_ = auVar111._8_4_ * auVar129._8_4_;
        auVar46._12_4_ = auVar111._12_4_ * auVar129._12_4_;
        auVar46._16_4_ = auVar111._16_4_ * auVar129._16_4_;
        auVar46._20_4_ = auVar111._20_4_ * auVar129._20_4_;
        auVar46._24_4_ = auVar111._24_4_ * auVar129._24_4_;
        auVar46._28_4_ = auVar129._28_4_;
        auVar98 = vfmsub231ps_fma(auVar46,auVar128,auVar112);
        auVar188._0_4_ = auVar128._0_4_ * auVar109._0_4_;
        auVar188._4_4_ = auVar128._4_4_ * auVar109._4_4_;
        auVar188._8_4_ = auVar128._8_4_ * auVar109._8_4_;
        auVar188._12_4_ = auVar128._12_4_ * auVar109._12_4_;
        auVar188._16_4_ = fVar192 * auVar109._16_4_;
        auVar188._20_4_ = fVar175 * auVar109._20_4_;
        auVar188._24_4_ = fVar185 * auVar109._24_4_;
        auVar188._28_4_ = 0;
        auVar96 = vfmsub231ps_fma(auVar188,auVar111,auVar127);
        auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar105,auVar120);
        auVar114 = vfmadd231ps_avx512vl(auVar120,auVar105,ZEXT1632(auVar98));
        auVar120 = vmaxps_avx(auVar113,auVar114);
        uVar157 = vcmpps_avx512vl(auVar120,auVar105,2);
        bVar92 = bVar92 & (byte)uVar157;
        in_ZMM20 = ZEXT3264(local_540);
        in_ZMM21 = ZEXT3264(local_560);
        auVar217 = ZEXT3264(local_460);
        if (bVar92 == 0) {
          bVar92 = 0;
          auVar201 = ZEXT3264(auVar108);
          auVar184 = ZEXT3264(auVar110);
        }
        else {
          auVar47._4_4_ = auVar112._4_4_ * auVar121._4_4_;
          auVar47._0_4_ = auVar112._0_4_ * auVar121._0_4_;
          auVar47._8_4_ = auVar112._8_4_ * auVar121._8_4_;
          auVar47._12_4_ = auVar112._12_4_ * auVar121._12_4_;
          auVar47._16_4_ = auVar112._16_4_ * auVar121._16_4_;
          auVar47._20_4_ = auVar112._20_4_ * auVar121._20_4_;
          auVar47._24_4_ = auVar112._24_4_ * auVar121._24_4_;
          auVar47._28_4_ = auVar120._28_4_;
          auVar218 = vfmsub231ps_fma(auVar47,auVar111,auVar119);
          auVar48._4_4_ = auVar119._4_4_ * auVar109._4_4_;
          auVar48._0_4_ = auVar119._0_4_ * auVar109._0_4_;
          auVar48._8_4_ = auVar119._8_4_ * auVar109._8_4_;
          auVar48._12_4_ = auVar119._12_4_ * auVar109._12_4_;
          auVar48._16_4_ = auVar119._16_4_ * auVar109._16_4_;
          auVar48._20_4_ = auVar119._20_4_ * auVar109._20_4_;
          auVar48._24_4_ = auVar119._24_4_ * auVar109._24_4_;
          auVar48._28_4_ = auVar119._28_4_;
          auVar96 = vfmsub231ps_fma(auVar48,auVar107,auVar112);
          auVar49._4_4_ = auVar111._4_4_ * auVar107._4_4_;
          auVar49._0_4_ = auVar111._0_4_ * auVar107._0_4_;
          auVar49._8_4_ = auVar111._8_4_ * auVar107._8_4_;
          auVar49._12_4_ = auVar111._12_4_ * auVar107._12_4_;
          auVar49._16_4_ = auVar111._16_4_ * auVar107._16_4_;
          auVar49._20_4_ = auVar111._20_4_ * auVar107._20_4_;
          auVar49._24_4_ = auVar111._24_4_ * auVar107._24_4_;
          auVar49._28_4_ = auVar111._28_4_;
          auVar6 = vfmsub231ps_fma(auVar49,auVar109,auVar121);
          auVar98 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar96),ZEXT1632(auVar6));
          auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar218),auVar105);
          auVar121 = vrcp14ps_avx512vl(auVar120);
          auVar25._8_4_ = 0x3f800000;
          auVar25._0_8_ = &DAT_3f8000003f800000;
          auVar25._12_4_ = 0x3f800000;
          auVar25._16_4_ = 0x3f800000;
          auVar25._20_4_ = 0x3f800000;
          auVar25._24_4_ = 0x3f800000;
          auVar25._28_4_ = 0x3f800000;
          auVar119 = vfnmadd213ps_avx512vl(auVar121,auVar120,auVar25);
          auVar98 = vfmadd132ps_fma(auVar119,auVar121,auVar121);
          auVar50._4_4_ = auVar6._4_4_ * auVar126._4_4_;
          auVar50._0_4_ = auVar6._0_4_ * auVar126._0_4_;
          auVar50._8_4_ = auVar6._8_4_ * auVar126._8_4_;
          auVar50._12_4_ = auVar6._12_4_ * auVar126._12_4_;
          auVar50._16_4_ = fVar186 * 0.0;
          auVar50._20_4_ = fVar191 * 0.0;
          auVar50._24_4_ = fVar155 * 0.0;
          auVar50._28_4_ = iVar1;
          auVar96 = vfmadd231ps_fma(auVar50,auVar117,ZEXT1632(auVar96));
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar118,ZEXT1632(auVar218));
          fVar186 = auVar98._0_4_;
          fVar155 = auVar98._4_4_;
          fVar191 = auVar98._8_4_;
          fVar192 = auVar98._12_4_;
          auVar121 = ZEXT1632(CONCAT412(auVar96._12_4_ * fVar192,
                                        CONCAT48(auVar96._8_4_ * fVar191,
                                                 CONCAT44(auVar96._4_4_ * fVar155,
                                                          auVar96._0_4_ * fVar186))));
          auVar203._4_4_ = uVar204;
          auVar203._0_4_ = uVar204;
          auVar203._8_4_ = uVar204;
          auVar203._12_4_ = uVar204;
          auVar203._16_4_ = uVar204;
          auVar203._20_4_ = uVar204;
          auVar203._24_4_ = uVar204;
          auVar203._28_4_ = uVar204;
          uVar157 = vcmpps_avx512vl(auVar203,auVar121,2);
          uVar156 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar26._4_4_ = uVar156;
          auVar26._0_4_ = uVar156;
          auVar26._8_4_ = uVar156;
          auVar26._12_4_ = uVar156;
          auVar26._16_4_ = uVar156;
          auVar26._20_4_ = uVar156;
          auVar26._24_4_ = uVar156;
          auVar26._28_4_ = uVar156;
          uVar23 = vcmpps_avx512vl(auVar121,auVar26,2);
          bVar92 = (byte)uVar157 & (byte)uVar23 & bVar92;
          if (bVar92 == 0) {
            bVar92 = 0;
            auVar201 = ZEXT3264(auVar108);
            auVar184 = ZEXT3264(auVar110);
          }
          else {
            uVar157 = vcmpps_avx512vl(auVar120,auVar105,4);
            if ((bVar92 & (byte)uVar157) == 0) {
              bVar92 = 0;
              auVar201 = ZEXT3264(auVar108);
              auVar184 = ZEXT3264(auVar110);
            }
            else {
              bVar92 = bVar92 & (byte)uVar157;
              fVar175 = auVar113._0_4_ * fVar186;
              fVar185 = auVar113._4_4_ * fVar155;
              auVar51._4_4_ = fVar185;
              auVar51._0_4_ = fVar175;
              fVar94 = auVar113._8_4_ * fVar191;
              auVar51._8_4_ = fVar94;
              fVar95 = auVar113._12_4_ * fVar192;
              auVar51._12_4_ = fVar95;
              fVar174 = auVar113._16_4_ * 0.0;
              auVar51._16_4_ = fVar174;
              fVar147 = auVar113._20_4_ * 0.0;
              auVar51._20_4_ = fVar147;
              fVar148 = auVar113._24_4_ * 0.0;
              auVar51._24_4_ = fVar148;
              auVar51._28_4_ = auVar113._28_4_;
              fVar186 = auVar114._0_4_ * fVar186;
              fVar155 = auVar114._4_4_ * fVar155;
              auVar52._4_4_ = fVar155;
              auVar52._0_4_ = fVar186;
              fVar191 = auVar114._8_4_ * fVar191;
              auVar52._8_4_ = fVar191;
              fVar192 = auVar114._12_4_ * fVar192;
              auVar52._12_4_ = fVar192;
              fVar149 = auVar114._16_4_ * 0.0;
              auVar52._16_4_ = fVar149;
              fVar151 = auVar114._20_4_ * 0.0;
              auVar52._20_4_ = fVar151;
              fVar152 = auVar114._24_4_ * 0.0;
              auVar52._24_4_ = fVar152;
              auVar52._28_4_ = auVar114._28_4_;
              auVar197._8_4_ = 0x3f800000;
              auVar197._0_8_ = &DAT_3f8000003f800000;
              auVar197._12_4_ = 0x3f800000;
              auVar197._16_4_ = 0x3f800000;
              auVar197._20_4_ = 0x3f800000;
              auVar197._24_4_ = 0x3f800000;
              auVar197._28_4_ = 0x3f800000;
              auVar110 = vsubps_avx(auVar197,auVar51);
              bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar85 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar85 >> 3) & 1);
              bVar18 = (bool)((byte)(uVar85 >> 4) & 1);
              bVar19 = (bool)((byte)(uVar85 >> 5) & 1);
              bVar20 = (bool)((byte)(uVar85 >> 6) & 1);
              bVar21 = SUB81(uVar85 >> 7,0);
              auVar201 = ZEXT3264(CONCAT428((uint)bVar21 * auVar113._28_4_ |
                                            (uint)!bVar21 * auVar110._28_4_,
                                            CONCAT424((uint)bVar20 * (int)fVar148 |
                                                      (uint)!bVar20 * auVar110._24_4_,
                                                      CONCAT420((uint)bVar19 * (int)fVar147 |
                                                                (uint)!bVar19 * auVar110._20_4_,
                                                                CONCAT416((uint)bVar18 *
                                                                          (int)fVar174 |
                                                                          (uint)!bVar18 *
                                                                          auVar110._16_4_,
                                                                          CONCAT412((uint)bVar17 *
                                                                                    (int)fVar95 |
                                                                                    (uint)!bVar17 *
                                                                                    auVar110._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar16 * (int)fVar94 |
                                                  (uint)!bVar16 * auVar110._8_4_,
                                                  CONCAT44((uint)bVar15 * (int)fVar185 |
                                                           (uint)!bVar15 * auVar110._4_4_,
                                                           (uint)(bVar84 & 1) * (int)fVar175 |
                                                           (uint)!(bool)(bVar84 & 1) *
                                                           auVar110._0_4_))))))));
              auVar110 = vsubps_avx(auVar197,auVar52);
              bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar85 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar85 >> 3) & 1);
              bVar18 = (bool)((byte)(uVar85 >> 4) & 1);
              bVar19 = (bool)((byte)(uVar85 >> 5) & 1);
              bVar20 = (bool)((byte)(uVar85 >> 6) & 1);
              bVar21 = SUB81(uVar85 >> 7,0);
              local_220._4_4_ = (uint)bVar15 * (int)fVar155 | (uint)!bVar15 * auVar110._4_4_;
              local_220._0_4_ =
                   (uint)(bVar84 & 1) * (int)fVar186 | (uint)!(bool)(bVar84 & 1) * auVar110._0_4_;
              local_220._8_4_ = (uint)bVar16 * (int)fVar191 | (uint)!bVar16 * auVar110._8_4_;
              local_220._12_4_ = (uint)bVar17 * (int)fVar192 | (uint)!bVar17 * auVar110._12_4_;
              local_220._16_4_ = (uint)bVar18 * (int)fVar149 | (uint)!bVar18 * auVar110._16_4_;
              local_220._20_4_ = (uint)bVar19 * (int)fVar151 | (uint)!bVar19 * auVar110._20_4_;
              local_220._24_4_ = (uint)bVar20 * (int)fVar152 | (uint)!bVar20 * auVar110._24_4_;
              local_220._28_4_ = (uint)bVar21 * auVar114._28_4_ | (uint)!bVar21 * auVar110._28_4_;
              auVar184 = ZEXT3264(auVar121);
            }
          }
        }
        auVar221 = ZEXT3264(local_5a0);
        auVar220 = ZEXT3264(local_580);
        if (bVar92 != 0) {
          auVar110 = vsubps_avx(ZEXT1632(auVar97),auVar106);
          auVar120 = auVar201._0_32_;
          auVar98 = vfmadd213ps_fma(auVar110,auVar120,auVar106);
          uVar156 = *(undefined4 *)((long)local_660->ray_space + k * 4 + -0x10);
          auVar27._4_4_ = uVar156;
          auVar27._0_4_ = uVar156;
          auVar27._8_4_ = uVar156;
          auVar27._12_4_ = uVar156;
          auVar27._16_4_ = uVar156;
          auVar27._20_4_ = uVar156;
          auVar27._24_4_ = uVar156;
          auVar27._28_4_ = uVar156;
          auVar110 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar98._12_4_ + auVar98._12_4_,
                                                        CONCAT48(auVar98._8_4_ + auVar98._8_4_,
                                                                 CONCAT44(auVar98._4_4_ +
                                                                          auVar98._4_4_,
                                                                          auVar98._0_4_ +
                                                                          auVar98._0_4_)))),auVar27)
          ;
          auVar108 = auVar184._0_32_;
          uVar157 = vcmpps_avx512vl(auVar108,auVar110,6);
          bVar92 = bVar92 & (byte)uVar157;
          if (bVar92 != 0) {
            auVar162._8_4_ = 0xbf800000;
            auVar162._0_8_ = 0xbf800000bf800000;
            auVar162._12_4_ = 0xbf800000;
            auVar162._16_4_ = 0xbf800000;
            auVar162._20_4_ = 0xbf800000;
            auVar162._24_4_ = 0xbf800000;
            auVar162._28_4_ = 0xbf800000;
            auVar28._8_4_ = 0x40000000;
            auVar28._0_8_ = 0x4000000040000000;
            auVar28._12_4_ = 0x40000000;
            auVar28._16_4_ = 0x40000000;
            auVar28._20_4_ = 0x40000000;
            auVar28._24_4_ = 0x40000000;
            auVar28._28_4_ = 0x40000000;
            local_3e0 = vfmadd132ps_avx512vl(local_220,auVar162,auVar28);
            local_220 = local_3e0;
            auVar110 = local_220;
            local_3a0 = 0;
            local_380 = local_5b0._0_8_;
            uStack_378 = local_5b0._8_8_;
            local_370 = local_5c0._0_8_;
            uStack_368 = local_5c0._8_8_;
            local_360 = local_5d0;
            uStack_358 = uStack_5c8;
            local_220 = auVar110;
            if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar186 = 1.0 / auVar209._0_4_;
              local_340[0] = fVar186 * (auVar201._0_4_ + 0.0);
              local_340[1] = fVar186 * (auVar201._4_4_ + 1.0);
              local_340[2] = fVar186 * (auVar201._8_4_ + 2.0);
              local_340[3] = fVar186 * (auVar201._12_4_ + 3.0);
              fStack_330 = fVar186 * (auVar201._16_4_ + 4.0);
              fStack_32c = fVar186 * (auVar201._20_4_ + 5.0);
              fStack_328 = fVar186 * (auVar201._24_4_ + 6.0);
              fStack_324 = auVar201._28_4_ + 7.0;
              local_220._0_8_ = local_3e0._0_8_;
              local_220._8_8_ = local_3e0._8_8_;
              local_220._16_8_ = local_3e0._16_8_;
              local_220._24_8_ = local_3e0._24_8_;
              local_320 = local_220._0_8_;
              uStack_318 = local_220._8_8_;
              uStack_310 = local_220._16_8_;
              uStack_308 = local_220._24_8_;
              local_300 = auVar108;
              auVar163._8_4_ = 0x7f800000;
              auVar163._0_8_ = 0x7f8000007f800000;
              auVar163._12_4_ = 0x7f800000;
              auVar163._16_4_ = 0x7f800000;
              auVar163._20_4_ = 0x7f800000;
              auVar163._24_4_ = 0x7f800000;
              auVar163._28_4_ = 0x7f800000;
              auVar110 = vblendmps_avx512vl(auVar163,auVar108);
              auVar132._0_4_ =
                   (uint)(bVar92 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar92 & 1) * 0x7f800000;
              bVar15 = (bool)(bVar92 >> 1 & 1);
              auVar132._4_4_ = (uint)bVar15 * auVar110._4_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar92 >> 2 & 1);
              auVar132._8_4_ = (uint)bVar15 * auVar110._8_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar92 >> 3 & 1);
              auVar132._12_4_ = (uint)bVar15 * auVar110._12_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar92 >> 4 & 1);
              auVar132._16_4_ = (uint)bVar15 * auVar110._16_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar92 >> 5 & 1);
              auVar132._20_4_ = (uint)bVar15 * auVar110._20_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar92 >> 6 & 1);
              auVar132._24_4_ = (uint)bVar15 * auVar110._24_4_ | (uint)!bVar15 * 0x7f800000;
              auVar132._28_4_ =
                   (uint)(bVar92 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar92 >> 7) * 0x7f800000;
              auVar110 = vshufps_avx(auVar132,auVar132,0xb1);
              auVar110 = vminps_avx(auVar132,auVar110);
              auVar121 = vshufpd_avx(auVar110,auVar110,5);
              auVar110 = vminps_avx(auVar110,auVar121);
              auVar121 = vpermpd_avx2(auVar110,0x4e);
              auVar110 = vminps_avx(auVar110,auVar121);
              uVar157 = vcmpps_avx512vl(auVar132,auVar110,0);
              bVar83 = (byte)uVar157 & bVar92;
              bVar84 = bVar92;
              if (bVar83 != 0) {
                bVar84 = bVar83;
              }
              uVar87 = 0;
              for (uVar86 = (uint)bVar84; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
                uVar87 = uVar87 + 1;
              }
              uVar85 = (ulong)uVar87;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar186 = local_340[uVar85];
                uVar156 = *(undefined4 *)((long)&local_320 + uVar85 * 4);
                fVar191 = 1.0 - fVar186;
                fVar155 = fVar191 * fVar191 * -3.0;
                auVar98 = vfmadd231ss_fma(ZEXT416((uint)(fVar191 * fVar191)),
                                          ZEXT416((uint)(fVar186 * fVar191)),ZEXT416(0xc0000000));
                auVar96 = vfmsub132ss_fma(ZEXT416((uint)(fVar186 * fVar191)),
                                          ZEXT416((uint)(fVar186 * fVar186)),ZEXT416(0x40000000));
                fVar191 = auVar98._0_4_ * 3.0;
                fVar192 = auVar96._0_4_ * 3.0;
                fVar175 = fVar186 * fVar186 * 3.0;
                auVar193._0_4_ = fVar175 * (float)local_5d0._0_4_;
                auVar193._4_4_ = fVar175 * (float)local_5d0._4_4_;
                auVar193._8_4_ = fVar175 * (float)uStack_5c8;
                auVar193._12_4_ = fVar175 * uStack_5c8._4_4_;
                auVar170._4_4_ = fVar192;
                auVar170._0_4_ = fVar192;
                auVar170._8_4_ = fVar192;
                auVar170._12_4_ = fVar192;
                auVar98 = vfmadd132ps_fma(auVar170,auVar193,local_5c0);
                auVar201 = ZEXT3264(auVar120);
                auVar178._4_4_ = fVar191;
                auVar178._0_4_ = fVar191;
                auVar178._8_4_ = fVar191;
                auVar178._12_4_ = fVar191;
                auVar98 = vfmadd132ps_fma(auVar178,auVar98,local_5b0);
                auVar171._4_4_ = fVar155;
                auVar171._0_4_ = fVar155;
                auVar171._8_4_ = fVar155;
                auVar171._12_4_ = fVar155;
                auVar98 = vfmadd213ps_fma(auVar171,auVar22,auVar98);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_300 + uVar85 * 4);
                auVar184 = ZEXT3264(auVar108);
                *(int *)(ray + k * 4 + 0xc0) = auVar98._0_4_;
                uVar11 = vextractps_avx(auVar98,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar11;
                uVar11 = vextractps_avx(auVar98,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar11;
                *(float *)(ray + k * 4 + 0xf0) = fVar186;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar156;
                *(undefined4 *)(ray + k * 4 + 0x110) = uVar3;
                *(uint *)(ray + k * 4 + 0x120) = uVar90;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_4d0 = vpbroadcastd_avx512vl();
                local_4e0 = vpbroadcastd_avx512vl();
                local_4f0 = local_5b0._0_4_;
                uStack_4ec = local_5b0._4_4_;
                uStack_4e8 = local_5b0._8_8_;
                local_500 = local_5c0._0_8_;
                uStack_4f8 = local_5c0._8_8_;
                local_510 = (float)local_5d0._0_4_;
                fStack_50c = (float)local_5d0._4_4_;
                fStack_508 = (float)uStack_5c8;
                fStack_504 = uStack_5c8._4_4_;
                local_400 = auVar120;
                local_3c0 = auVar108;
                local_39c = iVar10;
                local_390 = auVar22;
                local_350 = bVar92;
                do {
                  auVar218 = auVar219._0_16_;
                  local_440._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_2a0 = local_340[uVar85];
                  local_290 = *(undefined4 *)((long)&local_320 + uVar85 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_300 + uVar85 * 4);
                  local_658.context = context->user;
                  fVar155 = 1.0 - local_2a0;
                  fVar186 = fVar155 * fVar155 * -3.0;
                  auVar98 = vfmadd231ss_fma(ZEXT416((uint)(fVar155 * fVar155)),
                                            ZEXT416((uint)(local_2a0 * fVar155)),ZEXT416(0xc0000000)
                                           );
                  auVar96 = vfmsub132ss_fma(ZEXT416((uint)(local_2a0 * fVar155)),
                                            ZEXT416((uint)(local_2a0 * local_2a0)),
                                            ZEXT416(0x40000000));
                  fVar155 = auVar98._0_4_ * 3.0;
                  fVar191 = auVar96._0_4_ * 3.0;
                  fVar192 = local_2a0 * local_2a0 * 3.0;
                  auVar196._0_4_ = fVar192 * local_510;
                  auVar196._4_4_ = fVar192 * fStack_50c;
                  auVar196._8_4_ = fVar192 * fStack_508;
                  auVar196._12_4_ = fVar192 * fStack_504;
                  auVar160._4_4_ = fVar191;
                  auVar160._0_4_ = fVar191;
                  auVar160._8_4_ = fVar191;
                  auVar160._12_4_ = fVar191;
                  auVar80._8_8_ = uStack_4f8;
                  auVar80._0_8_ = local_500;
                  auVar98 = vfmadd132ps_fma(auVar160,auVar196,auVar80);
                  auVar181._4_4_ = fVar155;
                  auVar181._0_4_ = fVar155;
                  auVar181._8_4_ = fVar155;
                  auVar181._12_4_ = fVar155;
                  auVar81._4_4_ = uStack_4ec;
                  auVar81._0_4_ = local_4f0;
                  auVar81._8_8_ = uStack_4e8;
                  auVar98 = vfmadd132ps_fma(auVar181,auVar98,auVar81);
                  auVar161._4_4_ = fVar186;
                  auVar161._0_4_ = fVar186;
                  auVar161._8_4_ = fVar186;
                  auVar161._12_4_ = fVar186;
                  auVar98 = vfmadd213ps_fma(auVar161,auVar22,auVar98);
                  local_2d0 = auVar98._0_4_;
                  local_2c0 = vshufps_avx(auVar98,auVar98,0x55);
                  local_2b0 = vshufps_avx(auVar98,auVar98,0xaa);
                  iStack_2cc = local_2d0;
                  iStack_2c8 = local_2d0;
                  iStack_2c4 = local_2d0;
                  fStack_29c = local_2a0;
                  fStack_298 = local_2a0;
                  fStack_294 = local_2a0;
                  uStack_28c = local_290;
                  uStack_288 = local_290;
                  uStack_284 = local_290;
                  local_280 = local_4e0._0_8_;
                  uStack_278 = local_4e0._8_8_;
                  local_270 = local_4d0;
                  vpcmpeqd_avx2(ZEXT1632(local_4d0),ZEXT1632(local_4d0));
                  uStack_25c = (local_658.context)->instID[0];
                  local_260 = uStack_25c;
                  uStack_258 = uStack_25c;
                  uStack_254 = uStack_25c;
                  uStack_250 = (local_658.context)->instPrimID[0];
                  uStack_24c = uStack_250;
                  uStack_248 = uStack_250;
                  uStack_244 = uStack_250;
                  local_670 = local_410._0_8_;
                  uStack_668 = local_410._8_8_;
                  local_658.valid = (int *)&local_670;
                  local_658.geometryUserPtr = *(void **)(CONCAT44(uStack_49c,local_4a0) + 0x18);
                  local_658.hit = (RTCHitN *)&local_2d0;
                  local_658.N = 4;
                  pcVar14 = *(code **)(CONCAT44(uStack_49c,local_4a0) + 0x40);
                  local_480._0_8_ = uVar85;
                  local_658.ray = (RTCRayN *)ray;
                  if (pcVar14 != (code *)0x0) {
                    (*pcVar14)(&local_658);
                    auVar221 = ZEXT3264(local_5a0);
                    auVar220 = ZEXT3264(local_580);
                    auVar216 = ZEXT3264(local_620);
                    auVar215 = ZEXT3264(local_600);
                    auVar217 = ZEXT3264(local_460);
                    in_ZMM21 = ZEXT3264(local_560);
                    in_ZMM20 = ZEXT3264(local_540);
                    auVar98 = vxorps_avx512vl(auVar218,auVar218);
                    auVar219 = ZEXT1664(auVar98);
                    uVar85 = local_480._0_8_;
                    uVar204 = local_4c0._0_4_;
                  }
                  auVar98 = auVar219._0_16_;
                  auVar76._8_8_ = uStack_668;
                  auVar76._0_8_ = local_670;
                  uVar93 = vptestmd_avx512vl(auVar76,auVar76);
                  if ((uVar93 & 0xf) == 0) {
LAB_01d1ce7a:
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_440._0_4_;
                  }
                  else {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_49c,local_4a0) + 0x3e) & 0x40) != 0)))) {
                      (*p_Var13)(&local_658);
                      auVar221 = ZEXT3264(local_5a0);
                      auVar220 = ZEXT3264(local_580);
                      auVar216 = ZEXT3264(local_620);
                      auVar215 = ZEXT3264(local_600);
                      auVar217 = ZEXT3264(local_460);
                      in_ZMM21 = ZEXT3264(local_560);
                      in_ZMM20 = ZEXT3264(local_540);
                      auVar98 = vxorps_avx512vl(auVar98,auVar98);
                      auVar219 = ZEXT1664(auVar98);
                      uVar85 = local_480._0_8_;
                      uVar204 = local_4c0._0_4_;
                    }
                    auVar77._8_8_ = uStack_668;
                    auVar77._0_8_ = local_670;
                    uVar93 = vptestmd_avx512vl(auVar77,auVar77);
                    uVar93 = uVar93 & 0xf;
                    bVar84 = (byte)uVar93;
                    if (bVar84 == 0) goto LAB_01d1ce7a;
                    iVar1 = *(int *)(local_658.hit + 4);
                    iVar2 = *(int *)(local_658.hit + 8);
                    iVar73 = *(int *)(local_658.hit + 0xc);
                    bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                    bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                    bVar17 = SUB81(uVar93 >> 3,0);
                    *(uint *)(local_658.ray + 0xc0) =
                         (uint)(bVar84 & 1) * *(int *)local_658.hit |
                         (uint)!(bool)(bVar84 & 1) * *(int *)(local_658.ray + 0xc0);
                    *(uint *)(local_658.ray + 0xc4) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_658.ray + 0xc4);
                    *(uint *)(local_658.ray + 200) =
                         (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_658.ray + 200);
                    *(uint *)(local_658.ray + 0xcc) =
                         (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_658.ray + 0xcc);
                    iVar1 = *(int *)(local_658.hit + 0x14);
                    iVar2 = *(int *)(local_658.hit + 0x18);
                    iVar73 = *(int *)(local_658.hit + 0x1c);
                    bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                    bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                    bVar17 = SUB81(uVar93 >> 3,0);
                    *(uint *)(local_658.ray + 0xd0) =
                         (uint)(bVar84 & 1) * *(int *)(local_658.hit + 0x10) |
                         (uint)!(bool)(bVar84 & 1) * *(int *)(local_658.ray + 0xd0);
                    *(uint *)(local_658.ray + 0xd4) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_658.ray + 0xd4);
                    *(uint *)(local_658.ray + 0xd8) =
                         (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_658.ray + 0xd8);
                    *(uint *)(local_658.ray + 0xdc) =
                         (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_658.ray + 0xdc);
                    iVar1 = *(int *)(local_658.hit + 0x24);
                    iVar2 = *(int *)(local_658.hit + 0x28);
                    iVar73 = *(int *)(local_658.hit + 0x2c);
                    bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                    bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                    bVar17 = SUB81(uVar93 >> 3,0);
                    *(uint *)(local_658.ray + 0xe0) =
                         (uint)(bVar84 & 1) * *(int *)(local_658.hit + 0x20) |
                         (uint)!(bool)(bVar84 & 1) * *(int *)(local_658.ray + 0xe0);
                    *(uint *)(local_658.ray + 0xe4) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_658.ray + 0xe4);
                    *(uint *)(local_658.ray + 0xe8) =
                         (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_658.ray + 0xe8);
                    *(uint *)(local_658.ray + 0xec) =
                         (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_658.ray + 0xec);
                    iVar1 = *(int *)(local_658.hit + 0x34);
                    iVar2 = *(int *)(local_658.hit + 0x38);
                    iVar73 = *(int *)(local_658.hit + 0x3c);
                    bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                    bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                    bVar17 = SUB81(uVar93 >> 3,0);
                    *(uint *)(local_658.ray + 0xf0) =
                         (uint)(bVar84 & 1) * *(int *)(local_658.hit + 0x30) |
                         (uint)!(bool)(bVar84 & 1) * *(int *)(local_658.ray + 0xf0);
                    *(uint *)(local_658.ray + 0xf4) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_658.ray + 0xf4);
                    *(uint *)(local_658.ray + 0xf8) =
                         (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_658.ray + 0xf8);
                    *(uint *)(local_658.ray + 0xfc) =
                         (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_658.ray + 0xfc);
                    auVar98 = *(undefined1 (*) [16])(local_658.ray + 0x100);
                    auVar104._0_4_ =
                         (uint)(bVar84 & 1) * *(int *)(local_658.hit + 0x40) |
                         (uint)!(bool)(bVar84 & 1) * auVar98._0_4_;
                    bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                    auVar104._4_4_ =
                         (uint)bVar15 * *(int *)(local_658.hit + 0x44) |
                         (uint)!bVar15 * auVar98._4_4_;
                    bVar15 = (bool)((byte)(uVar93 >> 2) & 1);
                    auVar104._8_4_ =
                         (uint)bVar15 * *(int *)(local_658.hit + 0x48) |
                         (uint)!bVar15 * auVar98._8_4_;
                    bVar15 = SUB81(uVar93 >> 3,0);
                    auVar104._12_4_ =
                         (uint)bVar15 * *(int *)(local_658.hit + 0x4c) |
                         (uint)!bVar15 * auVar98._12_4_;
                    *(undefined1 (*) [16])(local_658.ray + 0x100) = auVar104;
                    auVar98 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_658.hit + 0x50));
                    *(undefined1 (*) [16])(local_658.ray + 0x110) = auVar98;
                    auVar98 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_658.hit + 0x60));
                    *(undefined1 (*) [16])(local_658.ray + 0x120) = auVar98;
                    auVar98 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_658.hit + 0x70));
                    *(undefined1 (*) [16])(local_658.ray + 0x130) = auVar98;
                    auVar98 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_658.hit + 0x80));
                    *(undefined1 (*) [16])(local_658.ray + 0x140) = auVar98;
                  }
                  auVar201 = ZEXT3264(auVar120);
                  auVar184 = ZEXT3264(auVar108);
                  bVar84 = ~(byte)(1 << ((uint)uVar85 & 0x1f)) & bVar92;
                  uVar156 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar35._4_4_ = uVar156;
                  auVar35._0_4_ = uVar156;
                  auVar35._8_4_ = uVar156;
                  auVar35._12_4_ = uVar156;
                  auVar35._16_4_ = uVar156;
                  auVar35._20_4_ = uVar156;
                  auVar35._24_4_ = uVar156;
                  auVar35._28_4_ = uVar156;
                  uVar157 = vcmpps_avx512vl(auVar108,auVar35,2);
                  bVar92 = bVar84 & (byte)uVar157;
                  if ((bVar84 & (byte)uVar157) != 0) {
                    auVar168._8_4_ = 0x7f800000;
                    auVar168._0_8_ = 0x7f8000007f800000;
                    auVar168._12_4_ = 0x7f800000;
                    auVar168._16_4_ = 0x7f800000;
                    auVar168._20_4_ = 0x7f800000;
                    auVar168._24_4_ = 0x7f800000;
                    auVar168._28_4_ = 0x7f800000;
                    auVar110 = vblendmps_avx512vl(auVar168,auVar108);
                    auVar146._0_4_ =
                         (uint)(bVar92 & 1) * auVar110._0_4_ |
                         (uint)!(bool)(bVar92 & 1) * 0x7f800000;
                    bVar15 = (bool)(bVar92 >> 1 & 1);
                    auVar146._4_4_ = (uint)bVar15 * auVar110._4_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar92 >> 2 & 1);
                    auVar146._8_4_ = (uint)bVar15 * auVar110._8_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar92 >> 3 & 1);
                    auVar146._12_4_ = (uint)bVar15 * auVar110._12_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar92 >> 4 & 1);
                    auVar146._16_4_ = (uint)bVar15 * auVar110._16_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar92 >> 5 & 1);
                    auVar146._20_4_ = (uint)bVar15 * auVar110._20_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar92 >> 6 & 1);
                    auVar146._24_4_ = (uint)bVar15 * auVar110._24_4_ | (uint)!bVar15 * 0x7f800000;
                    auVar146._28_4_ =
                         (uint)(bVar92 >> 7) * auVar110._28_4_ |
                         (uint)!(bool)(bVar92 >> 7) * 0x7f800000;
                    auVar110 = vshufps_avx(auVar146,auVar146,0xb1);
                    auVar110 = vminps_avx(auVar146,auVar110);
                    auVar121 = vshufpd_avx(auVar110,auVar110,5);
                    auVar110 = vminps_avx(auVar110,auVar121);
                    auVar121 = vpermpd_avx2(auVar110,0x4e);
                    auVar110 = vminps_avx(auVar110,auVar121);
                    uVar157 = vcmpps_avx512vl(auVar146,auVar110,0);
                    bVar83 = (byte)uVar157 & bVar92;
                    bVar84 = bVar92;
                    if (bVar83 != 0) {
                      bVar84 = bVar83;
                    }
                    uVar87 = 0;
                    for (uVar86 = (uint)bVar84; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000
                        ) {
                      uVar87 = uVar87 + 1;
                    }
                    uVar85 = (ulong)uVar87;
                  }
                } while (bVar92 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar10) {
        local_480 = vpbroadcastd_avx512vl();
        local_440 = vbroadcastss_avx512vl(auVar99);
        fStack_4b0 = 1.0 / (float)local_5e0._0_4_;
        local_4c0._4_4_ = fStack_4b0;
        local_4c0._0_4_ = fStack_4b0;
        fStack_4b8 = fStack_4b0;
        fStack_4b4 = fStack_4b0;
        local_5e0 = vpbroadcastd_avx512vl();
        local_4d0 = vpbroadcastd_avx512vl();
        lVar89 = 8;
        auVar108 = auVar201._0_32_;
        auVar110 = auVar184._0_32_;
        fStack_4ac = fStack_4b0;
        fStack_4a8 = fStack_4b0;
        fStack_4a4 = fStack_4b0;
        local_4a0 = uVar204;
        uStack_49c = uVar204;
        uStack_498 = uVar204;
        uStack_494 = uVar204;
        uStack_490 = uVar204;
        uStack_48c = uVar204;
        uStack_488 = uVar204;
        uStack_484 = uVar204;
        do {
          auVar120 = vpbroadcastd_avx512vl();
          auVar111 = vpor_avx2(auVar120,_DAT_0205a920);
          uVar23 = vpcmpd_avx512vl(auVar111,local_480,1);
          auVar120 = *(undefined1 (*) [32])(bezier_basis0 + lVar89 * 4 + lVar24);
          auVar121 = *(undefined1 (*) [32])(lVar24 + 0x2227768 + lVar89 * 4);
          auVar119 = *(undefined1 (*) [32])(lVar24 + 0x2227bec + lVar89 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar24 + 0x2228070 + lVar89 * 4);
          local_580 = auVar220._0_32_;
          auVar112 = vmulps_avx512vl(local_580,auVar109);
          local_5a0 = auVar221._0_32_;
          auVar118 = vmulps_avx512vl(local_5a0,auVar109);
          auVar53._4_4_ = auVar109._4_4_ * (float)local_140._4_4_;
          auVar53._0_4_ = auVar109._0_4_ * (float)local_140._0_4_;
          auVar53._8_4_ = auVar109._8_4_ * fStack_138;
          auVar53._12_4_ = auVar109._12_4_ * fStack_134;
          auVar53._16_4_ = auVar109._16_4_ * fStack_130;
          auVar53._20_4_ = auVar109._20_4_ * fStack_12c;
          auVar53._24_4_ = auVar109._24_4_ * fStack_128;
          auVar53._28_4_ = auVar111._28_4_;
          auVar111 = vfmadd231ps_avx512vl(auVar112,auVar119,local_a0);
          auVar112 = vfmadd231ps_avx512vl(auVar118,auVar119,local_c0);
          auVar118 = vfmadd231ps_avx512vl(auVar53,auVar119,local_120);
          auVar200 = auVar216._0_32_;
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar121,auVar200);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar121,local_200);
          auVar99 = vfmadd231ps_fma(auVar118,auVar121,local_100);
          auVar202 = auVar217._0_32_;
          auVar114 = vfmadd231ps_avx512vl(auVar111,auVar120,auVar202);
          auVar199 = auVar215._0_32_;
          auVar105 = vfmadd231ps_avx512vl(auVar112,auVar120,auVar199);
          auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar89 * 4 + lVar24);
          auVar112 = *(undefined1 (*) [32])(lVar24 + 0x2229b88 + lVar89 * 4);
          auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar120,local_e0);
          auVar118 = *(undefined1 (*) [32])(lVar24 + 0x222a00c + lVar89 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar24 + 0x222a490 + lVar89 * 4);
          auVar107 = vmulps_avx512vl(local_580,auVar117);
          auVar113 = vmulps_avx512vl(local_5a0,auVar117);
          auVar54._4_4_ = auVar117._4_4_ * (float)local_140._4_4_;
          auVar54._0_4_ = auVar117._0_4_ * (float)local_140._0_4_;
          auVar54._8_4_ = auVar117._8_4_ * fStack_138;
          auVar54._12_4_ = auVar117._12_4_ * fStack_134;
          auVar54._16_4_ = auVar117._16_4_ * fStack_130;
          auVar54._20_4_ = auVar117._20_4_ * fStack_12c;
          auVar54._24_4_ = auVar117._24_4_ * fStack_128;
          auVar54._28_4_ = uStack_124;
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar118,local_a0);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar118,local_c0);
          auVar106 = vfmadd231ps_avx512vl(auVar54,auVar118,local_120);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar112,auVar200);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar112,local_200);
          auVar98 = vfmadd231ps_fma(auVar106,auVar112,local_100);
          auVar106 = vfmadd231ps_avx512vl(auVar107,auVar111,auVar202);
          auVar115 = vfmadd231ps_avx512vl(auVar113,auVar111,auVar199);
          auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar111,local_e0);
          auVar116 = vmaxps_avx512vl(ZEXT1632(auVar99),ZEXT1632(auVar98));
          auVar107 = vsubps_avx(auVar106,auVar114);
          auVar113 = vsubps_avx(auVar115,auVar105);
          auVar133 = vmulps_avx512vl(auVar105,auVar107);
          auVar134 = vmulps_avx512vl(auVar114,auVar113);
          auVar133 = vsubps_avx512vl(auVar133,auVar134);
          auVar134 = vmulps_avx512vl(auVar113,auVar113);
          auVar134 = vfmadd231ps_avx512vl(auVar134,auVar107,auVar107);
          auVar116 = vmulps_avx512vl(auVar116,auVar116);
          auVar116 = vmulps_avx512vl(auVar116,auVar134);
          auVar133 = vmulps_avx512vl(auVar133,auVar133);
          uVar157 = vcmpps_avx512vl(auVar133,auVar116,2);
          local_350 = (byte)uVar23 & (byte)uVar157;
          if (local_350 == 0) {
            auVar215 = ZEXT3264(auVar199);
            auVar216 = ZEXT3264(auVar200);
          }
          else {
            auVar117 = vmulps_avx512vl(local_1c0,auVar117);
            auVar118 = vfmadd213ps_avx512vl(auVar118,local_1a0,auVar117);
            auVar112 = vfmadd213ps_avx512vl(auVar112,local_180,auVar118);
            auVar111 = vfmadd213ps_avx512vl(auVar111,local_160,auVar112);
            auVar109 = vmulps_avx512vl(local_1c0,auVar109);
            auVar119 = vfmadd213ps_avx512vl(auVar119,local_1a0,auVar109);
            auVar121 = vfmadd213ps_avx512vl(auVar121,local_180,auVar119);
            auVar112 = vfmadd213ps_avx512vl(auVar120,local_160,auVar121);
            auVar120 = *(undefined1 (*) [32])(lVar24 + 0x22284f4 + lVar89 * 4);
            auVar121 = *(undefined1 (*) [32])(lVar24 + 0x2228978 + lVar89 * 4);
            auVar119 = *(undefined1 (*) [32])(lVar24 + 0x2228dfc + lVar89 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar24 + 0x2229280 + lVar89 * 4);
            auVar118 = vmulps_avx512vl(local_580,auVar109);
            auVar117 = vmulps_avx512vl(local_5a0,auVar109);
            auVar109 = vmulps_avx512vl(local_1c0,auVar109);
            auVar118 = vfmadd231ps_avx512vl(auVar118,auVar119,local_a0);
            auVar117 = vfmadd231ps_avx512vl(auVar117,auVar119,local_c0);
            auVar119 = vfmadd231ps_avx512vl(auVar109,local_1a0,auVar119);
            auVar109 = vfmadd231ps_avx512vl(auVar118,auVar121,auVar200);
            auVar118 = vfmadd231ps_avx512vl(auVar117,auVar121,local_200);
            auVar121 = vfmadd231ps_avx512vl(auVar119,local_180,auVar121);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar120,auVar202);
            auVar118 = vfmadd231ps_avx512vl(auVar118,auVar120,auVar199);
            auVar117 = vfmadd231ps_avx512vl(auVar121,local_160,auVar120);
            auVar120 = *(undefined1 (*) [32])(lVar24 + 0x222a914 + lVar89 * 4);
            auVar121 = *(undefined1 (*) [32])(lVar24 + 0x222b21c + lVar89 * 4);
            auVar119 = *(undefined1 (*) [32])(lVar24 + 0x222b6a0 + lVar89 * 4);
            auVar116 = vmulps_avx512vl(local_580,auVar119);
            auVar133 = vmulps_avx512vl(local_5a0,auVar119);
            auVar119 = vmulps_avx512vl(local_1c0,auVar119);
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar121,local_a0);
            auVar133 = vfmadd231ps_avx512vl(auVar133,auVar121,local_c0);
            auVar119 = vfmadd231ps_avx512vl(auVar119,local_1a0,auVar121);
            auVar121 = *(undefined1 (*) [32])(lVar24 + 0x222ad98 + lVar89 * 4);
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar121,auVar200);
            auVar96 = vfmadd231ps_fma(auVar133,auVar121,local_200);
            auVar121 = vfmadd231ps_avx512vl(auVar119,local_180,auVar121);
            auVar119 = vfmadd231ps_avx512vl(auVar116,auVar120,auVar202);
            auVar116 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar120,auVar199);
            auVar121 = vfmadd231ps_avx512vl(auVar121,local_160,auVar120);
            auVar133 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar109,auVar133);
            vandps_avx512vl(auVar118,auVar133);
            auVar120 = vmaxps_avx(auVar133,auVar133);
            vandps_avx512vl(auVar117,auVar133);
            auVar120 = vmaxps_avx(auVar120,auVar133);
            uVar85 = vcmpps_avx512vl(auVar120,local_440,1);
            bVar15 = (bool)((byte)uVar85 & 1);
            auVar135._0_4_ = (float)((uint)bVar15 * auVar107._0_4_ | (uint)!bVar15 * auVar109._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar15 * auVar107._4_4_ | (uint)!bVar15 * auVar109._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar15 * auVar107._8_4_ | (uint)!bVar15 * auVar109._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar15 * auVar107._12_4_ | (uint)!bVar15 * auVar109._12_4_);
            bVar15 = (bool)((byte)(uVar85 >> 4) & 1);
            auVar135._16_4_ =
                 (float)((uint)bVar15 * auVar107._16_4_ | (uint)!bVar15 * auVar109._16_4_);
            bVar15 = (bool)((byte)(uVar85 >> 5) & 1);
            auVar135._20_4_ =
                 (float)((uint)bVar15 * auVar107._20_4_ | (uint)!bVar15 * auVar109._20_4_);
            bVar15 = (bool)((byte)(uVar85 >> 6) & 1);
            auVar135._24_4_ =
                 (float)((uint)bVar15 * auVar107._24_4_ | (uint)!bVar15 * auVar109._24_4_);
            bVar15 = SUB81(uVar85 >> 7,0);
            auVar135._28_4_ = (uint)bVar15 * auVar107._28_4_ | (uint)!bVar15 * auVar109._28_4_;
            bVar15 = (bool)((byte)uVar85 & 1);
            auVar136._0_4_ = (float)((uint)bVar15 * auVar113._0_4_ | (uint)!bVar15 * auVar118._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar15 * auVar113._4_4_ | (uint)!bVar15 * auVar118._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar15 * auVar113._8_4_ | (uint)!bVar15 * auVar118._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar15 * auVar113._12_4_ | (uint)!bVar15 * auVar118._12_4_);
            bVar15 = (bool)((byte)(uVar85 >> 4) & 1);
            auVar136._16_4_ =
                 (float)((uint)bVar15 * auVar113._16_4_ | (uint)!bVar15 * auVar118._16_4_);
            bVar15 = (bool)((byte)(uVar85 >> 5) & 1);
            auVar136._20_4_ =
                 (float)((uint)bVar15 * auVar113._20_4_ | (uint)!bVar15 * auVar118._20_4_);
            bVar15 = (bool)((byte)(uVar85 >> 6) & 1);
            auVar136._24_4_ =
                 (float)((uint)bVar15 * auVar113._24_4_ | (uint)!bVar15 * auVar118._24_4_);
            bVar15 = SUB81(uVar85 >> 7,0);
            auVar136._28_4_ = (uint)bVar15 * auVar113._28_4_ | (uint)!bVar15 * auVar118._28_4_;
            vandps_avx512vl(auVar119,auVar133);
            vandps_avx512vl(auVar116,auVar133);
            auVar120 = vmaxps_avx(auVar136,auVar136);
            vandps_avx512vl(auVar121,auVar133);
            auVar120 = vmaxps_avx(auVar120,auVar136);
            uVar85 = vcmpps_avx512vl(auVar120,local_440,1);
            bVar15 = (bool)((byte)uVar85 & 1);
            auVar137._0_4_ = (uint)bVar15 * auVar107._0_4_ | (uint)!bVar15 * auVar119._0_4_;
            bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar137._4_4_ = (uint)bVar15 * auVar107._4_4_ | (uint)!bVar15 * auVar119._4_4_;
            bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar137._8_4_ = (uint)bVar15 * auVar107._8_4_ | (uint)!bVar15 * auVar119._8_4_;
            bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar137._12_4_ = (uint)bVar15 * auVar107._12_4_ | (uint)!bVar15 * auVar119._12_4_;
            bVar15 = (bool)((byte)(uVar85 >> 4) & 1);
            auVar137._16_4_ = (uint)bVar15 * auVar107._16_4_ | (uint)!bVar15 * auVar119._16_4_;
            bVar15 = (bool)((byte)(uVar85 >> 5) & 1);
            auVar137._20_4_ = (uint)bVar15 * auVar107._20_4_ | (uint)!bVar15 * auVar119._20_4_;
            bVar15 = (bool)((byte)(uVar85 >> 6) & 1);
            auVar137._24_4_ = (uint)bVar15 * auVar107._24_4_ | (uint)!bVar15 * auVar119._24_4_;
            bVar15 = SUB81(uVar85 >> 7,0);
            auVar137._28_4_ = (uint)bVar15 * auVar107._28_4_ | (uint)!bVar15 * auVar119._28_4_;
            bVar15 = (bool)((byte)uVar85 & 1);
            auVar138._0_4_ = (float)((uint)bVar15 * auVar113._0_4_ | (uint)!bVar15 * auVar116._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar138._4_4_ = (float)((uint)bVar15 * auVar113._4_4_ | (uint)!bVar15 * auVar116._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar138._8_4_ = (float)((uint)bVar15 * auVar113._8_4_ | (uint)!bVar15 * auVar116._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar138._12_4_ =
                 (float)((uint)bVar15 * auVar113._12_4_ | (uint)!bVar15 * auVar116._12_4_);
            bVar15 = (bool)((byte)(uVar85 >> 4) & 1);
            auVar138._16_4_ =
                 (float)((uint)bVar15 * auVar113._16_4_ | (uint)!bVar15 * auVar116._16_4_);
            bVar15 = (bool)((byte)(uVar85 >> 5) & 1);
            auVar138._20_4_ =
                 (float)((uint)bVar15 * auVar113._20_4_ | (uint)!bVar15 * auVar116._20_4_);
            bVar15 = (bool)((byte)(uVar85 >> 6) & 1);
            auVar138._24_4_ =
                 (float)((uint)bVar15 * auVar113._24_4_ | (uint)!bVar15 * auVar116._24_4_);
            bVar15 = SUB81(uVar85 >> 7,0);
            auVar138._28_4_ = (uint)bVar15 * auVar113._28_4_ | (uint)!bVar15 * auVar116._28_4_;
            auVar206._8_4_ = 0x80000000;
            auVar206._0_8_ = 0x8000000080000000;
            auVar206._12_4_ = 0x80000000;
            auVar206._16_4_ = 0x80000000;
            auVar206._20_4_ = 0x80000000;
            auVar206._24_4_ = 0x80000000;
            auVar206._28_4_ = 0x80000000;
            auVar120 = vxorps_avx512vl(auVar137,auVar206);
            auVar116 = auVar219._0_32_;
            auVar121 = vfmadd213ps_avx512vl(auVar135,auVar135,auVar116);
            auVar96 = vfmadd231ps_fma(auVar121,auVar136,auVar136);
            auVar121 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
            auVar214._8_4_ = 0xbf000000;
            auVar214._0_8_ = 0xbf000000bf000000;
            auVar214._12_4_ = 0xbf000000;
            auVar214._16_4_ = 0xbf000000;
            auVar214._20_4_ = 0xbf000000;
            auVar214._24_4_ = 0xbf000000;
            auVar214._28_4_ = 0xbf000000;
            fVar186 = auVar121._0_4_;
            fVar155 = auVar121._4_4_;
            fVar191 = auVar121._8_4_;
            fVar192 = auVar121._12_4_;
            fVar175 = auVar121._16_4_;
            fVar185 = auVar121._20_4_;
            fVar94 = auVar121._24_4_;
            auVar55._4_4_ = fVar155 * fVar155 * fVar155 * auVar96._4_4_ * -0.5;
            auVar55._0_4_ = fVar186 * fVar186 * fVar186 * auVar96._0_4_ * -0.5;
            auVar55._8_4_ = fVar191 * fVar191 * fVar191 * auVar96._8_4_ * -0.5;
            auVar55._12_4_ = fVar192 * fVar192 * fVar192 * auVar96._12_4_ * -0.5;
            auVar55._16_4_ = fVar175 * fVar175 * fVar175 * -0.0;
            auVar55._20_4_ = fVar185 * fVar185 * fVar185 * -0.0;
            auVar55._24_4_ = fVar94 * fVar94 * fVar94 * -0.0;
            auVar55._28_4_ = auVar136._28_4_;
            auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar121 = vfmadd231ps_avx512vl(auVar55,auVar119,auVar121);
            auVar56._4_4_ = auVar136._4_4_ * auVar121._4_4_;
            auVar56._0_4_ = auVar136._0_4_ * auVar121._0_4_;
            auVar56._8_4_ = auVar136._8_4_ * auVar121._8_4_;
            auVar56._12_4_ = auVar136._12_4_ * auVar121._12_4_;
            auVar56._16_4_ = auVar136._16_4_ * auVar121._16_4_;
            auVar56._20_4_ = auVar136._20_4_ * auVar121._20_4_;
            auVar56._24_4_ = auVar136._24_4_ * auVar121._24_4_;
            auVar56._28_4_ = 0;
            auVar57._4_4_ = auVar121._4_4_ * -auVar135._4_4_;
            auVar57._0_4_ = auVar121._0_4_ * -auVar135._0_4_;
            auVar57._8_4_ = auVar121._8_4_ * -auVar135._8_4_;
            auVar57._12_4_ = auVar121._12_4_ * -auVar135._12_4_;
            auVar57._16_4_ = auVar121._16_4_ * -auVar135._16_4_;
            auVar57._20_4_ = auVar121._20_4_ * -auVar135._20_4_;
            auVar57._24_4_ = auVar121._24_4_ * -auVar135._24_4_;
            auVar57._28_4_ = auVar136._28_4_;
            auVar109 = vmulps_avx512vl(auVar121,auVar116);
            auVar121 = vfmadd213ps_avx512vl(auVar137,auVar137,auVar116);
            auVar121 = vfmadd231ps_avx512vl(auVar121,auVar138,auVar138);
            auVar118 = vrsqrt14ps_avx512vl(auVar121);
            auVar121 = vmulps_avx512vl(auVar121,auVar214);
            fVar186 = auVar118._0_4_;
            fVar155 = auVar118._4_4_;
            fVar191 = auVar118._8_4_;
            fVar192 = auVar118._12_4_;
            fVar175 = auVar118._16_4_;
            fVar185 = auVar118._20_4_;
            fVar94 = auVar118._24_4_;
            auVar58._4_4_ = fVar155 * fVar155 * fVar155 * auVar121._4_4_;
            auVar58._0_4_ = fVar186 * fVar186 * fVar186 * auVar121._0_4_;
            auVar58._8_4_ = fVar191 * fVar191 * fVar191 * auVar121._8_4_;
            auVar58._12_4_ = fVar192 * fVar192 * fVar192 * auVar121._12_4_;
            auVar58._16_4_ = fVar175 * fVar175 * fVar175 * auVar121._16_4_;
            auVar58._20_4_ = fVar185 * fVar185 * fVar185 * auVar121._20_4_;
            auVar58._24_4_ = fVar94 * fVar94 * fVar94 * auVar121._24_4_;
            auVar58._28_4_ = auVar121._28_4_;
            auVar121 = vfmadd231ps_avx512vl(auVar58,auVar119,auVar118);
            auVar59._4_4_ = auVar138._4_4_ * auVar121._4_4_;
            auVar59._0_4_ = auVar138._0_4_ * auVar121._0_4_;
            auVar59._8_4_ = auVar138._8_4_ * auVar121._8_4_;
            auVar59._12_4_ = auVar138._12_4_ * auVar121._12_4_;
            auVar59._16_4_ = auVar138._16_4_ * auVar121._16_4_;
            auVar59._20_4_ = auVar138._20_4_ * auVar121._20_4_;
            auVar59._24_4_ = auVar138._24_4_ * auVar121._24_4_;
            auVar59._28_4_ = auVar118._28_4_;
            auVar60._4_4_ = auVar121._4_4_ * auVar120._4_4_;
            auVar60._0_4_ = auVar121._0_4_ * auVar120._0_4_;
            auVar60._8_4_ = auVar121._8_4_ * auVar120._8_4_;
            auVar60._12_4_ = auVar121._12_4_ * auVar120._12_4_;
            auVar60._16_4_ = auVar121._16_4_ * auVar120._16_4_;
            auVar60._20_4_ = auVar121._20_4_ * auVar120._20_4_;
            auVar60._24_4_ = auVar121._24_4_ * auVar120._24_4_;
            auVar60._28_4_ = auVar120._28_4_;
            auVar120 = vmulps_avx512vl(auVar121,auVar116);
            auVar96 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar99),auVar114);
            auVar121 = ZEXT1632(auVar99);
            auVar218 = vfmadd213ps_fma(auVar57,auVar121,auVar105);
            auVar119 = vfmadd213ps_avx512vl(auVar109,auVar121,auVar112);
            auVar118 = vfmadd213ps_avx512vl(auVar59,ZEXT1632(auVar98),auVar106);
            auVar100 = vfnmadd213ps_fma(auVar56,auVar121,auVar114);
            auVar117 = ZEXT1632(auVar98);
            auVar6 = vfmadd213ps_fma(auVar60,auVar117,auVar115);
            auVar101 = vfnmadd213ps_fma(auVar57,auVar121,auVar105);
            auVar7 = vfmadd213ps_fma(auVar120,auVar117,auVar111);
            auVar105 = ZEXT1632(auVar99);
            auVar205 = vfnmadd231ps_fma(auVar112,auVar105,auVar109);
            auVar176 = vfnmadd213ps_fma(auVar59,auVar117,auVar106);
            auVar177 = vfnmadd213ps_fma(auVar60,auVar117,auVar115);
            auVar102 = vfnmadd231ps_fma(auVar111,ZEXT1632(auVar98),auVar120);
            auVar111 = vsubps_avx512vl(auVar118,ZEXT1632(auVar100));
            auVar120 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar101));
            auVar121 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar205));
            auVar61._4_4_ = auVar120._4_4_ * auVar205._4_4_;
            auVar61._0_4_ = auVar120._0_4_ * auVar205._0_4_;
            auVar61._8_4_ = auVar120._8_4_ * auVar205._8_4_;
            auVar61._12_4_ = auVar120._12_4_ * auVar205._12_4_;
            auVar61._16_4_ = auVar120._16_4_ * 0.0;
            auVar61._20_4_ = auVar120._20_4_ * 0.0;
            auVar61._24_4_ = auVar120._24_4_ * 0.0;
            auVar61._28_4_ = auVar109._28_4_;
            auVar99 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar101),auVar121);
            auVar62._4_4_ = auVar121._4_4_ * auVar100._4_4_;
            auVar62._0_4_ = auVar121._0_4_ * auVar100._0_4_;
            auVar62._8_4_ = auVar121._8_4_ * auVar100._8_4_;
            auVar62._12_4_ = auVar121._12_4_ * auVar100._12_4_;
            auVar62._16_4_ = auVar121._16_4_ * 0.0;
            auVar62._20_4_ = auVar121._20_4_ * 0.0;
            auVar62._24_4_ = auVar121._24_4_ * 0.0;
            auVar62._28_4_ = auVar121._28_4_;
            auVar8 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar205),auVar111);
            auVar63._4_4_ = auVar101._4_4_ * auVar111._4_4_;
            auVar63._0_4_ = auVar101._0_4_ * auVar111._0_4_;
            auVar63._8_4_ = auVar101._8_4_ * auVar111._8_4_;
            auVar63._12_4_ = auVar101._12_4_ * auVar111._12_4_;
            auVar63._16_4_ = auVar111._16_4_ * 0.0;
            auVar63._20_4_ = auVar111._20_4_ * 0.0;
            auVar63._24_4_ = auVar111._24_4_ * 0.0;
            auVar63._28_4_ = auVar111._28_4_;
            auVar97 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar100),auVar120);
            auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar116,ZEXT1632(auVar8));
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar116,ZEXT1632(auVar99));
            uVar85 = vcmpps_avx512vl(auVar120,auVar116,2);
            bVar92 = (byte)uVar85;
            fVar147 = (float)((uint)(bVar92 & 1) * auVar96._0_4_ |
                             (uint)!(bool)(bVar92 & 1) * auVar176._0_4_);
            bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
            fVar149 = (float)((uint)bVar15 * auVar96._4_4_ | (uint)!bVar15 * auVar176._4_4_);
            bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
            fVar152 = (float)((uint)bVar15 * auVar96._8_4_ | (uint)!bVar15 * auVar176._8_4_);
            bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
            fVar153 = (float)((uint)bVar15 * auVar96._12_4_ | (uint)!bVar15 * auVar176._12_4_);
            auVar117 = ZEXT1632(CONCAT412(fVar153,CONCAT48(fVar152,CONCAT44(fVar149,fVar147))));
            fVar148 = (float)((uint)(bVar92 & 1) * auVar218._0_4_ |
                             (uint)!(bool)(bVar92 & 1) * auVar177._0_4_);
            bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
            fVar151 = (float)((uint)bVar15 * auVar218._4_4_ | (uint)!bVar15 * auVar177._4_4_);
            bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
            fVar150 = (float)((uint)bVar15 * auVar218._8_4_ | (uint)!bVar15 * auVar177._8_4_);
            bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
            fVar154 = (float)((uint)bVar15 * auVar218._12_4_ | (uint)!bVar15 * auVar177._12_4_);
            auVar107 = ZEXT1632(CONCAT412(fVar154,CONCAT48(fVar150,CONCAT44(fVar151,fVar148))));
            auVar139._0_4_ =
                 (float)((uint)(bVar92 & 1) * auVar119._0_4_ |
                        (uint)!(bool)(bVar92 & 1) * auVar102._0_4_);
            bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar139._4_4_ = (float)((uint)bVar15 * auVar119._4_4_ | (uint)!bVar15 * auVar102._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar139._8_4_ = (float)((uint)bVar15 * auVar119._8_4_ | (uint)!bVar15 * auVar102._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar139._12_4_ =
                 (float)((uint)bVar15 * auVar119._12_4_ | (uint)!bVar15 * auVar102._12_4_);
            fVar186 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar119._16_4_);
            auVar139._16_4_ = fVar186;
            fVar155 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar119._20_4_);
            auVar139._20_4_ = fVar155;
            fVar191 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar119._24_4_);
            auVar139._24_4_ = fVar191;
            iVar1 = (uint)(byte)(uVar85 >> 7) * auVar119._28_4_;
            auVar139._28_4_ = iVar1;
            auVar120 = vblendmps_avx512vl(ZEXT1632(auVar100),auVar118);
            auVar140._0_4_ =
                 (uint)(bVar92 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar92 & 1) * auVar99._0_4_;
            bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar140._4_4_ = (uint)bVar15 * auVar120._4_4_ | (uint)!bVar15 * auVar99._4_4_;
            bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar140._8_4_ = (uint)bVar15 * auVar120._8_4_ | (uint)!bVar15 * auVar99._8_4_;
            bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar140._12_4_ = (uint)bVar15 * auVar120._12_4_ | (uint)!bVar15 * auVar99._12_4_;
            auVar140._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * auVar120._16_4_;
            auVar140._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * auVar120._20_4_;
            auVar140._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * auVar120._24_4_;
            auVar140._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar120._28_4_;
            auVar120 = vblendmps_avx512vl(ZEXT1632(auVar101),ZEXT1632(auVar6));
            auVar141._0_4_ =
                 (float)((uint)(bVar92 & 1) * auVar120._0_4_ |
                        (uint)!(bool)(bVar92 & 1) * auVar96._0_4_);
            bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar141._4_4_ = (float)((uint)bVar15 * auVar120._4_4_ | (uint)!bVar15 * auVar96._4_4_);
            bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar141._8_4_ = (float)((uint)bVar15 * auVar120._8_4_ | (uint)!bVar15 * auVar96._8_4_);
            bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar141._12_4_ =
                 (float)((uint)bVar15 * auVar120._12_4_ | (uint)!bVar15 * auVar96._12_4_);
            fVar175 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar120._16_4_);
            auVar141._16_4_ = fVar175;
            fVar185 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar120._20_4_);
            auVar141._20_4_ = fVar185;
            fVar192 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar120._24_4_);
            auVar141._24_4_ = fVar192;
            auVar141._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar120._28_4_;
            auVar120 = vblendmps_avx512vl(ZEXT1632(auVar205),ZEXT1632(auVar7));
            auVar142._0_4_ =
                 (float)((uint)(bVar92 & 1) * auVar120._0_4_ |
                        (uint)!(bool)(bVar92 & 1) * auVar218._0_4_);
            bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar142._4_4_ = (float)((uint)bVar15 * auVar120._4_4_ | (uint)!bVar15 * auVar218._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar142._8_4_ = (float)((uint)bVar15 * auVar120._8_4_ | (uint)!bVar15 * auVar218._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar142._12_4_ =
                 (float)((uint)bVar15 * auVar120._12_4_ | (uint)!bVar15 * auVar218._12_4_);
            fVar94 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar120._16_4_);
            auVar142._16_4_ = fVar94;
            fVar174 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar120._20_4_);
            auVar142._20_4_ = fVar174;
            fVar95 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar120._24_4_);
            auVar142._24_4_ = fVar95;
            iVar2 = (uint)(byte)(uVar85 >> 7) * auVar120._28_4_;
            auVar142._28_4_ = iVar2;
            auVar143._0_4_ =
                 (uint)(bVar92 & 1) * (int)auVar100._0_4_ |
                 (uint)!(bool)(bVar92 & 1) * auVar118._0_4_;
            bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar143._4_4_ = (uint)bVar15 * (int)auVar100._4_4_ | (uint)!bVar15 * auVar118._4_4_;
            bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar143._8_4_ = (uint)bVar15 * (int)auVar100._8_4_ | (uint)!bVar15 * auVar118._8_4_;
            bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar143._12_4_ = (uint)bVar15 * (int)auVar100._12_4_ | (uint)!bVar15 * auVar118._12_4_;
            auVar143._16_4_ = (uint)!(bool)((byte)(uVar85 >> 4) & 1) * auVar118._16_4_;
            auVar143._20_4_ = (uint)!(bool)((byte)(uVar85 >> 5) & 1) * auVar118._20_4_;
            auVar143._24_4_ = (uint)!(bool)((byte)(uVar85 >> 6) & 1) * auVar118._24_4_;
            auVar143._28_4_ = (uint)!SUB81(uVar85 >> 7,0) * auVar118._28_4_;
            bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar85 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar85 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar85 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar85 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar118 = vsubps_avx512vl(auVar143,auVar117);
            auVar121 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar101._12_4_ |
                                                     (uint)!bVar19 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar17 * (int)auVar101._8_4_ |
                                                              (uint)!bVar17 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar15 *
                                                                       (int)auVar101._4_4_ |
                                                                       (uint)!bVar15 * auVar6._4_4_,
                                                                       (uint)(bVar92 & 1) *
                                                                       (int)auVar101._0_4_ |
                                                                       (uint)!(bool)(bVar92 & 1) *
                                                                       auVar6._0_4_)))),auVar107);
            auVar119 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar205._12_4_ |
                                                     (uint)!bVar20 * auVar7._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar205._8_4_ |
                                                              (uint)!bVar18 * auVar7._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar205._4_4_ |
                                                                       (uint)!bVar16 * auVar7._4_4_,
                                                                       (uint)(bVar92 & 1) *
                                                                       (int)auVar205._0_4_ |
                                                                       (uint)!(bool)(bVar92 & 1) *
                                                                       auVar7._0_4_)))),auVar139);
            auVar109 = vsubps_avx(auVar117,auVar140);
            auVar111 = vsubps_avx(auVar107,auVar141);
            auVar112 = vsubps_avx(auVar139,auVar142);
            auVar64._4_4_ = auVar119._4_4_ * fVar149;
            auVar64._0_4_ = auVar119._0_4_ * fVar147;
            auVar64._8_4_ = auVar119._8_4_ * fVar152;
            auVar64._12_4_ = auVar119._12_4_ * fVar153;
            auVar64._16_4_ = auVar119._16_4_ * 0.0;
            auVar64._20_4_ = auVar119._20_4_ * 0.0;
            auVar64._24_4_ = auVar119._24_4_ * 0.0;
            auVar64._28_4_ = 0;
            auVar99 = vfmsub231ps_fma(auVar64,auVar139,auVar118);
            auVar183._0_4_ = fVar148 * auVar118._0_4_;
            auVar183._4_4_ = fVar151 * auVar118._4_4_;
            auVar183._8_4_ = fVar150 * auVar118._8_4_;
            auVar183._12_4_ = fVar154 * auVar118._12_4_;
            auVar183._16_4_ = auVar118._16_4_ * 0.0;
            auVar183._20_4_ = auVar118._20_4_ * 0.0;
            auVar183._24_4_ = auVar118._24_4_ * 0.0;
            auVar183._28_4_ = 0;
            auVar96 = vfmsub231ps_fma(auVar183,auVar117,auVar121);
            auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar116,ZEXT1632(auVar99));
            auVar189._0_4_ = auVar121._0_4_ * auVar139._0_4_;
            auVar189._4_4_ = auVar121._4_4_ * auVar139._4_4_;
            auVar189._8_4_ = auVar121._8_4_ * auVar139._8_4_;
            auVar189._12_4_ = auVar121._12_4_ * auVar139._12_4_;
            auVar189._16_4_ = auVar121._16_4_ * fVar186;
            auVar189._20_4_ = auVar121._20_4_ * fVar155;
            auVar189._24_4_ = auVar121._24_4_ * fVar191;
            auVar189._28_4_ = 0;
            auVar99 = vfmsub231ps_fma(auVar189,auVar107,auVar119);
            auVar113 = vfmadd231ps_avx512vl(auVar120,auVar116,ZEXT1632(auVar99));
            auVar120 = vmulps_avx512vl(auVar112,auVar140);
            auVar120 = vfmsub231ps_avx512vl(auVar120,auVar109,auVar142);
            auVar65._4_4_ = auVar111._4_4_ * auVar142._4_4_;
            auVar65._0_4_ = auVar111._0_4_ * auVar142._0_4_;
            auVar65._8_4_ = auVar111._8_4_ * auVar142._8_4_;
            auVar65._12_4_ = auVar111._12_4_ * auVar142._12_4_;
            auVar65._16_4_ = auVar111._16_4_ * fVar94;
            auVar65._20_4_ = auVar111._20_4_ * fVar174;
            auVar65._24_4_ = auVar111._24_4_ * fVar95;
            auVar65._28_4_ = iVar2;
            auVar99 = vfmsub231ps_fma(auVar65,auVar141,auVar112);
            auVar190._0_4_ = auVar141._0_4_ * auVar109._0_4_;
            auVar190._4_4_ = auVar141._4_4_ * auVar109._4_4_;
            auVar190._8_4_ = auVar141._8_4_ * auVar109._8_4_;
            auVar190._12_4_ = auVar141._12_4_ * auVar109._12_4_;
            auVar190._16_4_ = fVar175 * auVar109._16_4_;
            auVar190._20_4_ = fVar185 * auVar109._20_4_;
            auVar190._24_4_ = fVar192 * auVar109._24_4_;
            auVar190._28_4_ = 0;
            auVar96 = vfmsub231ps_fma(auVar190,auVar111,auVar140);
            auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar116,auVar120);
            auVar114 = vfmadd231ps_avx512vl(auVar120,auVar116,ZEXT1632(auVar99));
            auVar120 = vmaxps_avx(auVar113,auVar114);
            uVar157 = vcmpps_avx512vl(auVar120,auVar116,2);
            local_350 = local_350 & (byte)uVar157;
            if (local_350 == 0) {
LAB_01d1c51f:
              local_350 = 0;
            }
            else {
              auVar66._4_4_ = auVar112._4_4_ * auVar121._4_4_;
              auVar66._0_4_ = auVar112._0_4_ * auVar121._0_4_;
              auVar66._8_4_ = auVar112._8_4_ * auVar121._8_4_;
              auVar66._12_4_ = auVar112._12_4_ * auVar121._12_4_;
              auVar66._16_4_ = auVar112._16_4_ * auVar121._16_4_;
              auVar66._20_4_ = auVar112._20_4_ * auVar121._20_4_;
              auVar66._24_4_ = auVar112._24_4_ * auVar121._24_4_;
              auVar66._28_4_ = auVar120._28_4_;
              auVar218 = vfmsub231ps_fma(auVar66,auVar111,auVar119);
              auVar67._4_4_ = auVar119._4_4_ * auVar109._4_4_;
              auVar67._0_4_ = auVar119._0_4_ * auVar109._0_4_;
              auVar67._8_4_ = auVar119._8_4_ * auVar109._8_4_;
              auVar67._12_4_ = auVar119._12_4_ * auVar109._12_4_;
              auVar67._16_4_ = auVar119._16_4_ * auVar109._16_4_;
              auVar67._20_4_ = auVar119._20_4_ * auVar109._20_4_;
              auVar67._24_4_ = auVar119._24_4_ * auVar109._24_4_;
              auVar67._28_4_ = auVar119._28_4_;
              auVar96 = vfmsub231ps_fma(auVar67,auVar118,auVar112);
              auVar68._4_4_ = auVar111._4_4_ * auVar118._4_4_;
              auVar68._0_4_ = auVar111._0_4_ * auVar118._0_4_;
              auVar68._8_4_ = auVar111._8_4_ * auVar118._8_4_;
              auVar68._12_4_ = auVar111._12_4_ * auVar118._12_4_;
              auVar68._16_4_ = auVar111._16_4_ * auVar118._16_4_;
              auVar68._20_4_ = auVar111._20_4_ * auVar118._20_4_;
              auVar68._24_4_ = auVar111._24_4_ * auVar118._24_4_;
              auVar68._28_4_ = auVar111._28_4_;
              auVar6 = vfmsub231ps_fma(auVar68,auVar109,auVar121);
              auVar99 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar96),ZEXT1632(auVar6));
              auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),ZEXT1632(auVar218),auVar116);
              auVar121 = vrcp14ps_avx512vl(auVar120);
              auVar30._8_4_ = 0x3f800000;
              auVar30._0_8_ = &DAT_3f8000003f800000;
              auVar30._12_4_ = 0x3f800000;
              auVar30._16_4_ = 0x3f800000;
              auVar30._20_4_ = 0x3f800000;
              auVar30._24_4_ = 0x3f800000;
              auVar30._28_4_ = 0x3f800000;
              auVar119 = vfnmadd213ps_avx512vl(auVar121,auVar120,auVar30);
              auVar99 = vfmadd132ps_fma(auVar119,auVar121,auVar121);
              auVar69._4_4_ = auVar6._4_4_ * auVar139._4_4_;
              auVar69._0_4_ = auVar6._0_4_ * auVar139._0_4_;
              auVar69._8_4_ = auVar6._8_4_ * auVar139._8_4_;
              auVar69._12_4_ = auVar6._12_4_ * auVar139._12_4_;
              auVar69._16_4_ = fVar186 * 0.0;
              auVar69._20_4_ = fVar155 * 0.0;
              auVar69._24_4_ = fVar191 * 0.0;
              auVar69._28_4_ = iVar1;
              auVar96 = vfmadd231ps_fma(auVar69,auVar107,ZEXT1632(auVar96));
              auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar117,ZEXT1632(auVar218));
              fVar186 = auVar99._0_4_;
              fVar155 = auVar99._4_4_;
              fVar191 = auVar99._8_4_;
              fVar192 = auVar99._12_4_;
              auVar121 = ZEXT1632(CONCAT412(auVar96._12_4_ * fVar192,
                                            CONCAT48(auVar96._8_4_ * fVar191,
                                                     CONCAT44(auVar96._4_4_ * fVar155,
                                                              auVar96._0_4_ * fVar186))));
              auVar82._4_4_ = uStack_49c;
              auVar82._0_4_ = local_4a0;
              auVar82._8_4_ = uStack_498;
              auVar82._12_4_ = uStack_494;
              auVar82._16_4_ = uStack_490;
              auVar82._20_4_ = uStack_48c;
              auVar82._24_4_ = uStack_488;
              auVar82._28_4_ = uStack_484;
              uVar157 = vcmpps_avx512vl(auVar121,auVar82,0xd);
              uVar156 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar31._4_4_ = uVar156;
              auVar31._0_4_ = uVar156;
              auVar31._8_4_ = uVar156;
              auVar31._12_4_ = uVar156;
              auVar31._16_4_ = uVar156;
              auVar31._20_4_ = uVar156;
              auVar31._24_4_ = uVar156;
              auVar31._28_4_ = uVar156;
              uVar23 = vcmpps_avx512vl(auVar121,auVar31,2);
              local_350 = (byte)uVar157 & (byte)uVar23 & local_350;
              if (local_350 == 0) goto LAB_01d1c51f;
              uVar157 = vcmpps_avx512vl(auVar120,auVar116,4);
              if ((local_350 & (byte)uVar157) == 0) {
                local_350 = 0;
              }
              else {
                local_350 = local_350 & (byte)uVar157;
                fVar175 = auVar113._0_4_ * fVar186;
                fVar185 = auVar113._4_4_ * fVar155;
                auVar70._4_4_ = fVar185;
                auVar70._0_4_ = fVar175;
                fVar94 = auVar113._8_4_ * fVar191;
                auVar70._8_4_ = fVar94;
                fVar95 = auVar113._12_4_ * fVar192;
                auVar70._12_4_ = fVar95;
                fVar174 = auVar113._16_4_ * 0.0;
                auVar70._16_4_ = fVar174;
                fVar147 = auVar113._20_4_ * 0.0;
                auVar70._20_4_ = fVar147;
                fVar148 = auVar113._24_4_ * 0.0;
                auVar70._24_4_ = fVar148;
                auVar70._28_4_ = auVar113._28_4_;
                fVar186 = auVar114._0_4_ * fVar186;
                fVar155 = auVar114._4_4_ * fVar155;
                auVar71._4_4_ = fVar155;
                auVar71._0_4_ = fVar186;
                fVar191 = auVar114._8_4_ * fVar191;
                auVar71._8_4_ = fVar191;
                fVar192 = auVar114._12_4_ * fVar192;
                auVar71._12_4_ = fVar192;
                fVar149 = auVar114._16_4_ * 0.0;
                auVar71._16_4_ = fVar149;
                fVar151 = auVar114._20_4_ * 0.0;
                auVar71._20_4_ = fVar151;
                fVar152 = auVar114._24_4_ * 0.0;
                auVar71._24_4_ = fVar152;
                auVar71._28_4_ = auVar114._28_4_;
                auVar198._8_4_ = 0x3f800000;
                auVar198._0_8_ = &DAT_3f8000003f800000;
                auVar198._12_4_ = 0x3f800000;
                auVar198._16_4_ = 0x3f800000;
                auVar198._20_4_ = 0x3f800000;
                auVar198._24_4_ = 0x3f800000;
                auVar198._28_4_ = 0x3f800000;
                auVar120 = vsubps_avx512vl(auVar198,auVar70);
                bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
                bVar16 = (bool)((byte)(uVar85 >> 2) & 1);
                bVar17 = (bool)((byte)(uVar85 >> 3) & 1);
                bVar18 = (bool)((byte)(uVar85 >> 4) & 1);
                bVar19 = (bool)((byte)(uVar85 >> 5) & 1);
                bVar20 = (bool)((byte)(uVar85 >> 6) & 1);
                bVar21 = SUB81(uVar85 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar21 * auVar113._28_4_ |
                                              (uint)!bVar21 * auVar120._28_4_,
                                              CONCAT424((uint)bVar20 * (int)fVar148 |
                                                        (uint)!bVar20 * auVar120._24_4_,
                                                        CONCAT420((uint)bVar19 * (int)fVar147 |
                                                                  (uint)!bVar19 * auVar120._20_4_,
                                                                  CONCAT416((uint)bVar18 *
                                                                            (int)fVar174 |
                                                                            (uint)!bVar18 *
                                                                            auVar120._16_4_,
                                                                            CONCAT412((uint)bVar17 *
                                                                                      (int)fVar95 |
                                                                                      (uint)!bVar17
                                                                                      * auVar120.
                                                  _12_4_,CONCAT48((uint)bVar16 * (int)fVar94 |
                                                                  (uint)!bVar16 * auVar120._8_4_,
                                                                  CONCAT44((uint)bVar15 *
                                                                           (int)fVar185 |
                                                                           (uint)!bVar15 *
                                                                           auVar120._4_4_,
                                                                           (uint)(bVar92 & 1) *
                                                                           (int)fVar175 |
                                                                           (uint)!(bool)(bVar92 & 1)
                                                                           * auVar120._0_4_))))))));
                auVar120 = vsubps_avx(auVar198,auVar71);
                bVar15 = (bool)((byte)(uVar85 >> 1) & 1);
                bVar16 = (bool)((byte)(uVar85 >> 2) & 1);
                bVar17 = (bool)((byte)(uVar85 >> 3) & 1);
                bVar18 = (bool)((byte)(uVar85 >> 4) & 1);
                bVar19 = (bool)((byte)(uVar85 >> 5) & 1);
                bVar20 = (bool)((byte)(uVar85 >> 6) & 1);
                bVar21 = SUB81(uVar85 >> 7,0);
                local_240._4_4_ = (uint)bVar15 * (int)fVar155 | (uint)!bVar15 * auVar120._4_4_;
                local_240._0_4_ =
                     (uint)(bVar92 & 1) * (int)fVar186 | (uint)!(bool)(bVar92 & 1) * auVar120._0_4_;
                local_240._8_4_ = (uint)bVar16 * (int)fVar191 | (uint)!bVar16 * auVar120._8_4_;
                local_240._12_4_ = (uint)bVar17 * (int)fVar192 | (uint)!bVar17 * auVar120._12_4_;
                local_240._16_4_ = (uint)bVar18 * (int)fVar149 | (uint)!bVar18 * auVar120._16_4_;
                local_240._20_4_ = (uint)bVar19 * (int)fVar151 | (uint)!bVar19 * auVar120._20_4_;
                local_240._24_4_ = (uint)bVar20 * (int)fVar152 | (uint)!bVar20 * auVar120._24_4_;
                local_240._28_4_ = (uint)bVar21 * auVar114._28_4_ | (uint)!bVar21 * auVar120._28_4_;
                in_ZMM21 = ZEXT3264(auVar121);
              }
            }
            auVar216 = ZEXT3264(local_620);
            auVar215 = ZEXT3264(local_600);
            if (local_350 != 0) {
              auVar120 = vsubps_avx(ZEXT1632(auVar98),auVar105);
              local_540 = in_ZMM20._0_32_;
              auVar120 = vfmadd213ps_avx512vl(auVar120,local_540,auVar105);
              auVar164._0_4_ = auVar120._0_4_ + auVar120._0_4_;
              auVar164._4_4_ = auVar120._4_4_ + auVar120._4_4_;
              auVar164._8_4_ = auVar120._8_4_ + auVar120._8_4_;
              auVar164._12_4_ = auVar120._12_4_ + auVar120._12_4_;
              auVar164._16_4_ = auVar120._16_4_ + auVar120._16_4_;
              auVar164._20_4_ = auVar120._20_4_ + auVar120._20_4_;
              auVar164._24_4_ = auVar120._24_4_ + auVar120._24_4_;
              auVar164._28_4_ = auVar120._28_4_ + auVar120._28_4_;
              uVar156 = *(undefined4 *)((long)local_660->ray_space + k * 4 + -0x10);
              auVar32._4_4_ = uVar156;
              auVar32._0_4_ = uVar156;
              auVar32._8_4_ = uVar156;
              auVar32._12_4_ = uVar156;
              auVar32._16_4_ = uVar156;
              auVar32._20_4_ = uVar156;
              auVar32._24_4_ = uVar156;
              auVar32._28_4_ = uVar156;
              auVar120 = vmulps_avx512vl(auVar164,auVar32);
              local_560 = in_ZMM21._0_32_;
              uVar157 = vcmpps_avx512vl(local_560,auVar120,6);
              local_350 = local_350 & (byte)uVar157;
              if (local_350 != 0) {
                auVar165._8_4_ = 0xbf800000;
                auVar165._0_8_ = 0xbf800000bf800000;
                auVar165._12_4_ = 0xbf800000;
                auVar165._16_4_ = 0xbf800000;
                auVar165._20_4_ = 0xbf800000;
                auVar165._24_4_ = 0xbf800000;
                auVar165._28_4_ = 0xbf800000;
                auVar33._8_4_ = 0x40000000;
                auVar33._0_8_ = 0x4000000040000000;
                auVar33._12_4_ = 0x40000000;
                auVar33._16_4_ = 0x40000000;
                auVar33._20_4_ = 0x40000000;
                auVar33._24_4_ = 0x40000000;
                auVar33._28_4_ = 0x40000000;
                local_3e0 = vfmadd132ps_avx512vl(local_240,auVar165,auVar33);
                local_240 = local_3e0;
                auVar120 = local_240;
                local_3a0 = (undefined4)lVar89;
                local_380 = local_5b0._0_8_;
                uStack_378 = local_5b0._8_8_;
                local_370 = local_5c0._0_8_;
                uStack_368 = local_5c0._8_8_;
                local_360 = local_5d0;
                uStack_358 = uStack_5c8;
                pGVar12 = (context->scene->geometries).items[uVar90].ptr;
                local_240 = auVar120;
                if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar120 = vaddps_avx512vl(local_540,_DAT_02020f40);
                  auVar99 = vcvtsi2ss_avx512f(auVar217._0_16_,local_3a0);
                  fVar186 = auVar99._0_4_;
                  local_340[0] = (fVar186 + auVar120._0_4_) * (float)local_4c0._0_4_;
                  local_340[1] = (fVar186 + auVar120._4_4_) * (float)local_4c0._4_4_;
                  local_340[2] = (fVar186 + auVar120._8_4_) * fStack_4b8;
                  local_340[3] = (fVar186 + auVar120._12_4_) * fStack_4b4;
                  fStack_330 = (fVar186 + auVar120._16_4_) * fStack_4b0;
                  fStack_32c = (fVar186 + auVar120._20_4_) * fStack_4ac;
                  fStack_328 = (fVar186 + auVar120._24_4_) * fStack_4a8;
                  fStack_324 = fVar186 + auVar120._28_4_;
                  local_240._0_8_ = local_3e0._0_8_;
                  local_240._8_8_ = local_3e0._8_8_;
                  local_240._16_8_ = local_3e0._16_8_;
                  local_240._24_8_ = local_3e0._24_8_;
                  local_320 = local_240._0_8_;
                  uStack_318 = local_240._8_8_;
                  uStack_310 = local_240._16_8_;
                  uStack_308 = local_240._24_8_;
                  local_300 = local_560;
                  auVar166._8_4_ = 0x7f800000;
                  auVar166._0_8_ = 0x7f8000007f800000;
                  auVar166._12_4_ = 0x7f800000;
                  auVar166._16_4_ = 0x7f800000;
                  auVar166._20_4_ = 0x7f800000;
                  auVar166._24_4_ = 0x7f800000;
                  auVar166._28_4_ = 0x7f800000;
                  auVar120 = vblendmps_avx512vl(auVar166,local_560);
                  auVar144._0_4_ =
                       (uint)(local_350 & 1) * auVar120._0_4_ |
                       (uint)!(bool)(local_350 & 1) * 0x7f800000;
                  bVar15 = (bool)(local_350 >> 1 & 1);
                  auVar144._4_4_ = (uint)bVar15 * auVar120._4_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_350 >> 2 & 1);
                  auVar144._8_4_ = (uint)bVar15 * auVar120._8_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_350 >> 3 & 1);
                  auVar144._12_4_ = (uint)bVar15 * auVar120._12_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_350 >> 4 & 1);
                  auVar144._16_4_ = (uint)bVar15 * auVar120._16_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_350 >> 5 & 1);
                  auVar144._20_4_ = (uint)bVar15 * auVar120._20_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_350 >> 6 & 1);
                  auVar144._24_4_ = (uint)bVar15 * auVar120._24_4_ | (uint)!bVar15 * 0x7f800000;
                  auVar144._28_4_ =
                       (uint)(local_350 >> 7) * auVar120._28_4_ |
                       (uint)!(bool)(local_350 >> 7) * 0x7f800000;
                  auVar120 = vshufps_avx(auVar144,auVar144,0xb1);
                  auVar120 = vminps_avx(auVar144,auVar120);
                  auVar121 = vshufpd_avx(auVar120,auVar120,5);
                  auVar120 = vminps_avx(auVar120,auVar121);
                  auVar121 = vpermpd_avx2(auVar120,0x4e);
                  auVar120 = vminps_avx(auVar120,auVar121);
                  uVar157 = vcmpps_avx512vl(auVar144,auVar120,0);
                  bVar84 = (byte)uVar157 & local_350;
                  bVar92 = local_350;
                  if (bVar84 != 0) {
                    bVar92 = bVar84;
                  }
                  uVar204 = 0;
                  for (uVar87 = (uint)bVar92; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000)
                  {
                    uVar204 = uVar204 + 1;
                  }
                  uVar85 = (ulong)uVar204;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar186 = local_340[uVar85];
                    uVar156 = *(undefined4 *)((long)&local_320 + uVar85 * 4);
                    fVar191 = 1.0 - fVar186;
                    fVar155 = fVar191 * fVar191 * -3.0;
                    auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar191 * fVar191)),
                                              ZEXT416((uint)(fVar186 * fVar191)),ZEXT416(0xc0000000)
                                             );
                    auVar98 = vfmsub132ss_fma(ZEXT416((uint)(fVar186 * fVar191)),
                                              ZEXT416((uint)(fVar186 * fVar186)),ZEXT416(0x40000000)
                                             );
                    fVar191 = auVar99._0_4_ * 3.0;
                    fVar192 = auVar98._0_4_ * 3.0;
                    fVar175 = fVar186 * fVar186 * 3.0;
                    auVar194._0_4_ = fVar175 * (float)local_5d0._0_4_;
                    auVar194._4_4_ = fVar175 * (float)local_5d0._4_4_;
                    auVar194._8_4_ = fVar175 * (float)uStack_5c8;
                    auVar194._12_4_ = fVar175 * uStack_5c8._4_4_;
                    auVar172._4_4_ = fVar192;
                    auVar172._0_4_ = fVar192;
                    auVar172._8_4_ = fVar192;
                    auVar172._12_4_ = fVar192;
                    auVar99 = vfmadd132ps_fma(auVar172,auVar194,local_5c0);
                    auVar179._4_4_ = fVar191;
                    auVar179._0_4_ = fVar191;
                    auVar179._8_4_ = fVar191;
                    auVar179._12_4_ = fVar191;
                    auVar99 = vfmadd132ps_fma(auVar179,auVar99,local_5b0);
                    auVar173._4_4_ = fVar155;
                    auVar173._0_4_ = fVar155;
                    auVar173._8_4_ = fVar155;
                    auVar173._12_4_ = fVar155;
                    auVar99 = vfmadd213ps_fma(auVar173,auVar22,auVar99);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_300 + uVar85 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar99._0_4_;
                    uVar11 = vextractps_avx(auVar99,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar11;
                    uVar11 = vextractps_avx(auVar99,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar11;
                    *(float *)(ray + k * 4 + 0xf0) = fVar186;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar156;
                    *(undefined4 *)(ray + k * 4 + 0x110) = uVar3;
                    *(uint *)(ray + k * 4 + 0x120) = uVar90;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_500 = local_5b0._0_8_;
                    uStack_4f8 = local_5b0._8_8_;
                    local_510 = local_5c0._0_4_;
                    fStack_50c = local_5c0._4_4_;
                    fStack_508 = local_5c0._8_4_;
                    fStack_504 = local_5c0._12_4_;
                    local_1d0 = local_5d0;
                    uStack_1c8 = uStack_5c8;
                    local_628 = lVar89;
                    local_400 = local_540;
                    local_3c0 = local_560;
                    local_39c = iVar10;
                    local_390 = auVar22;
                    bVar92 = local_350;
                    do {
                      auVar99 = local_4e0;
                      local_4e0._1_3_ = 0;
                      local_4e0[0] = bVar92;
                      auVar96 = auVar219._0_16_;
                      local_4e0._4_12_ = auVar99._4_12_;
                      local_4f0 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_2a0 = local_340[uVar85];
                      local_290 = *(undefined4 *)((long)&local_320 + uVar85 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_300 + uVar85 * 4);
                      local_658.context = context->user;
                      fVar155 = 1.0 - local_2a0;
                      fVar186 = fVar155 * fVar155 * -3.0;
                      auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar155 * fVar155)),
                                                ZEXT416((uint)(local_2a0 * fVar155)),
                                                ZEXT416(0xc0000000));
                      auVar98 = vfmsub132ss_fma(ZEXT416((uint)(local_2a0 * fVar155)),
                                                ZEXT416((uint)(local_2a0 * local_2a0)),
                                                ZEXT416(0x40000000));
                      fVar155 = auVar99._0_4_ * 3.0;
                      fVar191 = auVar98._0_4_ * 3.0;
                      fVar192 = local_2a0 * local_2a0 * 3.0;
                      auVar195._0_4_ = fVar192 * (float)local_1d0;
                      auVar195._4_4_ = fVar192 * local_1d0._4_4_;
                      auVar195._8_4_ = fVar192 * (float)uStack_1c8;
                      auVar195._12_4_ = fVar192 * uStack_1c8._4_4_;
                      auVar158._4_4_ = fVar191;
                      auVar158._0_4_ = fVar191;
                      auVar158._8_4_ = fVar191;
                      auVar158._12_4_ = fVar191;
                      auVar78._4_4_ = fStack_50c;
                      auVar78._0_4_ = local_510;
                      auVar78._8_4_ = fStack_508;
                      auVar78._12_4_ = fStack_504;
                      auVar99 = vfmadd132ps_fma(auVar158,auVar195,auVar78);
                      auVar180._4_4_ = fVar155;
                      auVar180._0_4_ = fVar155;
                      auVar180._8_4_ = fVar155;
                      auVar180._12_4_ = fVar155;
                      auVar79._8_8_ = uStack_4f8;
                      auVar79._0_8_ = local_500;
                      auVar99 = vfmadd132ps_fma(auVar180,auVar99,auVar79);
                      auVar159._4_4_ = fVar186;
                      auVar159._0_4_ = fVar186;
                      auVar159._8_4_ = fVar186;
                      auVar159._12_4_ = fVar186;
                      auVar99 = vfmadd213ps_fma(auVar159,auVar22,auVar99);
                      local_2d0 = auVar99._0_4_;
                      local_2c0 = vshufps_avx(auVar99,auVar99,0x55);
                      local_2b0 = vshufps_avx(auVar99,auVar99,0xaa);
                      iStack_2cc = local_2d0;
                      iStack_2c8 = local_2d0;
                      iStack_2c4 = local_2d0;
                      fStack_29c = local_2a0;
                      fStack_298 = local_2a0;
                      fStack_294 = local_2a0;
                      uStack_28c = local_290;
                      uStack_288 = local_290;
                      uStack_284 = local_290;
                      local_280 = local_4d0._0_8_;
                      uStack_278 = local_4d0._8_8_;
                      local_270 = local_5e0;
                      vpcmpeqd_avx2(ZEXT1632(local_5e0),ZEXT1632(local_5e0));
                      uStack_25c = (local_658.context)->instID[0];
                      local_260 = uStack_25c;
                      uStack_258 = uStack_25c;
                      uStack_254 = uStack_25c;
                      uStack_250 = (local_658.context)->instPrimID[0];
                      uStack_24c = uStack_250;
                      uStack_248 = uStack_250;
                      uStack_244 = uStack_250;
                      local_670 = local_410._0_8_;
                      uStack_668 = local_410._8_8_;
                      local_658.valid = (int *)&local_670;
                      local_658.geometryUserPtr = pGVar12->userPtr;
                      local_658.hit = (RTCHitN *)&local_2d0;
                      local_658.N = 4;
                      local_658.ray = (RTCRayN *)ray;
                      if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar12->intersectionFilterN)(&local_658);
                        auVar221 = ZEXT3264(local_5a0);
                        auVar220 = ZEXT3264(local_580);
                        auVar216 = ZEXT3264(local_620);
                        auVar215 = ZEXT3264(local_600);
                        auVar217 = ZEXT3264(local_460);
                        in_ZMM21 = ZEXT3264(local_560);
                        in_ZMM20 = ZEXT3264(local_540);
                        auVar99 = vxorps_avx512vl(auVar96,auVar96);
                        auVar219 = ZEXT1664(auVar99);
                        lVar89 = local_628;
                      }
                      auVar99 = auVar219._0_16_;
                      auVar74._8_8_ = uStack_668;
                      auVar74._0_8_ = local_670;
                      uVar93 = vptestmd_avx512vl(auVar74,auVar74);
                      if ((uVar93 & 0xf) == 0) {
LAB_01d1c93f:
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_4f0;
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var13)(&local_658);
                          auVar221 = ZEXT3264(local_5a0);
                          auVar220 = ZEXT3264(local_580);
                          auVar216 = ZEXT3264(local_620);
                          auVar215 = ZEXT3264(local_600);
                          auVar217 = ZEXT3264(local_460);
                          in_ZMM21 = ZEXT3264(local_560);
                          in_ZMM20 = ZEXT3264(local_540);
                          auVar99 = vxorps_avx512vl(auVar99,auVar99);
                          auVar219 = ZEXT1664(auVar99);
                          lVar89 = local_628;
                        }
                        auVar75._8_8_ = uStack_668;
                        auVar75._0_8_ = local_670;
                        uVar93 = vptestmd_avx512vl(auVar75,auVar75);
                        uVar93 = uVar93 & 0xf;
                        bVar92 = (byte)uVar93;
                        if (bVar92 == 0) goto LAB_01d1c93f;
                        iVar1 = *(int *)(local_658.hit + 4);
                        iVar2 = *(int *)(local_658.hit + 8);
                        iVar73 = *(int *)(local_658.hit + 0xc);
                        bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                        bVar17 = SUB81(uVar93 >> 3,0);
                        *(uint *)(local_658.ray + 0xc0) =
                             (uint)(bVar92 & 1) * *(int *)local_658.hit |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_658.ray + 0xc0);
                        *(uint *)(local_658.ray + 0xc4) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_658.ray + 0xc4);
                        *(uint *)(local_658.ray + 200) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_658.ray + 200);
                        *(uint *)(local_658.ray + 0xcc) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_658.ray + 0xcc);
                        iVar1 = *(int *)(local_658.hit + 0x14);
                        iVar2 = *(int *)(local_658.hit + 0x18);
                        iVar73 = *(int *)(local_658.hit + 0x1c);
                        bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                        bVar17 = SUB81(uVar93 >> 3,0);
                        *(uint *)(local_658.ray + 0xd0) =
                             (uint)(bVar92 & 1) * *(int *)(local_658.hit + 0x10) |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_658.ray + 0xd0);
                        *(uint *)(local_658.ray + 0xd4) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_658.ray + 0xd4);
                        *(uint *)(local_658.ray + 0xd8) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_658.ray + 0xd8);
                        *(uint *)(local_658.ray + 0xdc) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_658.ray + 0xdc);
                        iVar1 = *(int *)(local_658.hit + 0x24);
                        iVar2 = *(int *)(local_658.hit + 0x28);
                        iVar73 = *(int *)(local_658.hit + 0x2c);
                        bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                        bVar17 = SUB81(uVar93 >> 3,0);
                        *(uint *)(local_658.ray + 0xe0) =
                             (uint)(bVar92 & 1) * *(int *)(local_658.hit + 0x20) |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_658.ray + 0xe0);
                        *(uint *)(local_658.ray + 0xe4) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_658.ray + 0xe4);
                        *(uint *)(local_658.ray + 0xe8) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_658.ray + 0xe8);
                        *(uint *)(local_658.ray + 0xec) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_658.ray + 0xec);
                        iVar1 = *(int *)(local_658.hit + 0x34);
                        iVar2 = *(int *)(local_658.hit + 0x38);
                        iVar73 = *(int *)(local_658.hit + 0x3c);
                        bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
                        bVar17 = SUB81(uVar93 >> 3,0);
                        *(uint *)(local_658.ray + 0xf0) =
                             (uint)(bVar92 & 1) * *(int *)(local_658.hit + 0x30) |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_658.ray + 0xf0);
                        *(uint *)(local_658.ray + 0xf4) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_658.ray + 0xf4);
                        *(uint *)(local_658.ray + 0xf8) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_658.ray + 0xf8);
                        *(uint *)(local_658.ray + 0xfc) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_658.ray + 0xfc);
                        auVar99 = *(undefined1 (*) [16])(local_658.ray + 0x100);
                        auVar103._0_4_ =
                             (uint)(bVar92 & 1) * *(int *)(local_658.hit + 0x40) |
                             (uint)!(bool)(bVar92 & 1) * auVar99._0_4_;
                        bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
                        auVar103._4_4_ =
                             (uint)bVar15 * *(int *)(local_658.hit + 0x44) |
                             (uint)!bVar15 * auVar99._4_4_;
                        bVar15 = (bool)((byte)(uVar93 >> 2) & 1);
                        auVar103._8_4_ =
                             (uint)bVar15 * *(int *)(local_658.hit + 0x48) |
                             (uint)!bVar15 * auVar99._8_4_;
                        bVar15 = SUB81(uVar93 >> 3,0);
                        auVar103._12_4_ =
                             (uint)bVar15 * *(int *)(local_658.hit + 0x4c) |
                             (uint)!bVar15 * auVar99._12_4_;
                        *(undefined1 (*) [16])(local_658.ray + 0x100) = auVar103;
                        auVar99 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_658.hit + 0x50));
                        *(undefined1 (*) [16])(local_658.ray + 0x110) = auVar99;
                        auVar99 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_658.hit + 0x60));
                        *(undefined1 (*) [16])(local_658.ray + 0x120) = auVar99;
                        auVar99 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_658.hit + 0x70));
                        *(undefined1 (*) [16])(local_658.ray + 0x130) = auVar99;
                        auVar99 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_658.hit + 0x80));
                        *(undefined1 (*) [16])(local_658.ray + 0x140) = auVar99;
                      }
                      bVar84 = ~(byte)(1 << ((uint)uVar85 & 0x1f)) & local_4e0[0];
                      uVar156 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar34._4_4_ = uVar156;
                      auVar34._0_4_ = uVar156;
                      auVar34._8_4_ = uVar156;
                      auVar34._12_4_ = uVar156;
                      auVar34._16_4_ = uVar156;
                      auVar34._20_4_ = uVar156;
                      auVar34._24_4_ = uVar156;
                      auVar34._28_4_ = uVar156;
                      uVar157 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar34,2);
                      bVar92 = bVar84 & (byte)uVar157;
                      if ((bVar84 & (byte)uVar157) != 0) {
                        auVar167._8_4_ = 0x7f800000;
                        auVar167._0_8_ = 0x7f8000007f800000;
                        auVar167._12_4_ = 0x7f800000;
                        auVar167._16_4_ = 0x7f800000;
                        auVar167._20_4_ = 0x7f800000;
                        auVar167._24_4_ = 0x7f800000;
                        auVar167._28_4_ = 0x7f800000;
                        auVar120 = vblendmps_avx512vl(auVar167,in_ZMM21._0_32_);
                        auVar145._0_4_ =
                             (uint)(bVar92 & 1) * auVar120._0_4_ |
                             (uint)!(bool)(bVar92 & 1) * 0x7f800000;
                        bVar15 = (bool)(bVar92 >> 1 & 1);
                        auVar145._4_4_ = (uint)bVar15 * auVar120._4_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar92 >> 2 & 1);
                        auVar145._8_4_ = (uint)bVar15 * auVar120._8_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar92 >> 3 & 1);
                        auVar145._12_4_ =
                             (uint)bVar15 * auVar120._12_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar92 >> 4 & 1);
                        auVar145._16_4_ =
                             (uint)bVar15 * auVar120._16_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar92 >> 5 & 1);
                        auVar145._20_4_ =
                             (uint)bVar15 * auVar120._20_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar92 >> 6 & 1);
                        auVar145._24_4_ =
                             (uint)bVar15 * auVar120._24_4_ | (uint)!bVar15 * 0x7f800000;
                        auVar145._28_4_ =
                             (uint)(bVar92 >> 7) * auVar120._28_4_ |
                             (uint)!(bool)(bVar92 >> 7) * 0x7f800000;
                        auVar120 = vshufps_avx(auVar145,auVar145,0xb1);
                        auVar120 = vminps_avx(auVar145,auVar120);
                        auVar121 = vshufpd_avx(auVar120,auVar120,5);
                        auVar120 = vminps_avx(auVar120,auVar121);
                        auVar121 = vpermpd_avx2(auVar120,0x4e);
                        auVar120 = vminps_avx(auVar120,auVar121);
                        uVar157 = vcmpps_avx512vl(auVar145,auVar120,0);
                        bVar83 = (byte)uVar157 & bVar92;
                        bVar84 = bVar92;
                        if (bVar83 != 0) {
                          bVar84 = bVar83;
                        }
                        uVar204 = 0;
                        for (uVar87 = (uint)bVar84; (uVar87 & 1) == 0;
                            uVar87 = uVar87 >> 1 | 0x80000000) {
                          uVar204 = uVar204 + 1;
                        }
                        uVar85 = (ulong)uVar204;
                      }
                    } while (bVar92 != 0);
                  }
                }
              }
            }
          }
          auVar201 = ZEXT3264(auVar108);
          auVar184 = ZEXT3264(auVar110);
          lVar89 = lVar89 + 8;
        } while ((int)lVar89 < iVar10);
      }
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar29._4_4_ = uVar3;
      auVar29._0_4_ = uVar3;
      auVar29._8_4_ = uVar3;
      auVar29._12_4_ = uVar3;
      auVar29._16_4_ = uVar3;
      auVar29._20_4_ = uVar3;
      auVar29._24_4_ = uVar3;
      auVar29._28_4_ = uVar3;
      uVar157 = vcmpps_avx512vl(local_80,auVar29,2);
      uVar90 = (uint)uVar91 & (uint)uVar157;
      uVar91 = (ulong)uVar90;
    } while (uVar90 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }